

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::InnerProduct_x86_avx512::forward
          (InnerProduct_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  undefined4 uVar2;
  float fVar3;
  uint uVar4;
  int *piVar5;
  void *pvVar6;
  undefined4 *puVar7;
  uint *puVar8;
  void *pvVar9;
  size_t sVar10;
  float *pfVar11;
  void *pvVar12;
  bool bVar13;
  byte bVar14;
  ulong uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [64];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  float afVar71 [16];
  float afVar72 [16];
  float afVar73 [16];
  float afVar74 [16];
  float afVar75 [16];
  float afVar76 [16];
  float afVar77 [16];
  float afVar78 [16];
  float afVar79 [16];
  float afVar80 [16];
  float afVar81 [16];
  float afVar82 [16];
  int iVar83;
  uint uVar84;
  ulong uVar85;
  undefined1 (*pauVar86) [64];
  undefined1 (*pauVar87) [32];
  ulong uVar88;
  long lVar89;
  undefined1 (*pauVar90) [32];
  int iVar91;
  long lVar92;
  long lVar93;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  int iVar94;
  long lVar95;
  undefined1 (*pauVar96) [32];
  long lVar97;
  long lVar98;
  long lVar99;
  long lVar100;
  ulong uVar101;
  long lVar102;
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar103 [16];
  undefined1 auVar172 [64];
  undefined1 auVar173 [64];
  undefined1 auVar174 [64];
  undefined1 auVar175 [64];
  undefined1 auVar176 [64];
  undefined1 auVar177 [64];
  undefined1 auVar178 [64];
  undefined1 auVar179 [64];
  undefined1 auVar180 [64];
  undefined1 auVar181 [64];
  undefined1 auVar182 [64];
  float fVar183;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  __m128 pos;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  float fVar204;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  v4sf one;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar220;
  __m128 pos_1;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [32];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [32];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [32];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 in_ZMM16 [64];
  undefined1 auVar248 [64];
  undefined1 in_ZMM17 [64];
  undefined1 auVar249 [64];
  undefined1 in_ZMM18 [64];
  undefined1 auVar250 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM23 [64];
  undefined1 in_ZMM30 [64];
  undefined1 auVar251 [64];
  int local_148;
  long local_120;
  long local_118;
  undefined1 (*local_108) [32];
  int *piStack_100;
  size_t local_f8;
  int local_f0;
  Allocator *local_e8;
  int local_e0;
  int local_dc;
  undefined8 local_d8;
  int local_d0;
  size_t local_c8;
  long local_c0;
  ulong local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  ulong local_88;
  long local_80;
  Option opt_flatten;
  undefined1 auVar165 [32];
  
  auVar103 = in_ZMM30._0_16_;
  if ((opt->use_int8_inference == true) && ((this->super_InnerProduct).int8_scale_term != 0)) {
    iVar83 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar83;
  }
  iVar83 = cpu_support_x86_f16c();
  if ((iVar83 != 0) && (opt->use_fp16_storage == true)) {
    iVar83 = forward_fp16s(this,bottom_blob,top_blob,opt);
    return iVar83;
  }
  local_e0 = bottom_blob->dims;
  if (local_e0 == 2) {
    iVar83 = (this->super_InnerProduct).num_output;
    local_dc = bottom_blob->w;
    if (local_dc == (this->super_InnerProduct).weight_data_size / iVar83) {
      Mat::create(top_blob,iVar83,bottom_blob->h,bottom_blob->elemsize,bottom_blob->elempack,
                  opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      innerproduct_gemm_sse
                (bottom_blob,top_blob,&this->weight_data_tm,&(this->super_InnerProduct).bias_data,
                 (this->super_InnerProduct).activation_type,
                 &(this->super_InnerProduct).activation_params,opt);
      return 0;
    }
  }
  else {
    local_dc = bottom_blob->w;
  }
  piVar5 = bottom_blob->refcount;
  local_108 = (undefined1 (*) [32])bottom_blob->data;
  piStack_100 = bottom_blob->refcount;
  local_f8 = bottom_blob->elemsize;
  local_f0 = bottom_blob->elempack;
  local_e8 = bottom_blob->allocator;
  local_d8._0_4_ = bottom_blob->h;
  local_d8._4_4_ = bottom_blob->d;
  local_d0 = bottom_blob->c;
  local_c8 = bottom_blob->cstep;
  iVar83 = local_e0;
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + 1;
    UNLOCK();
    iVar83 = bottom_blob->dims;
  }
  local_148 = -100;
  if (iVar83 != 1) {
    opt_flatten._16_48_ = SUB6448(*opt,0x10);
    opt_flatten._0_8_ = SUB648(*opt,0);
    opt_flatten.blob_allocator = opt->workspace_allocator;
    (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,&local_108);
    if ((local_108 == (undefined1 (*) [32])0x0) || ((long)local_d0 * local_c8 == 0))
    goto LAB_002946c1;
  }
  uVar4 = (this->super_InnerProduct).num_output;
  if (opt->use_packing_layout == true) {
    if ((uVar4 & 0xf) == 0) {
      uVar84 = 0x10;
    }
    else if ((uVar4 & 7) == 0) {
      uVar84 = 8;
    }
    else {
      uVar84 = (uint)((uVar4 & 3) == 0) * 3 + 1;
    }
  }
  else {
    uVar84 = 1;
  }
  Mat::create(top_blob,(int)uVar4 / (int)uVar84,(ulong)uVar84 * (local_f8 / (ulong)(long)local_f0),
              uVar84,opt->blob_allocator);
  pauVar96 = local_108;
  afVar82 = _ps512_cephes_log_q2;
  afVar81 = _ps512_cephes_log_q1;
  afVar80 = ::_ps512_cephes_exp_p5;
  afVar79 = ::_ps512_cephes_exp_p4;
  afVar78 = ::_ps512_cephes_exp_p3;
  afVar77 = ::_ps512_cephes_exp_p2;
  afVar76 = ::_ps512_cephes_exp_p1;
  afVar75 = ::_ps512_cephes_exp_p0;
  afVar74 = ::_ps512_cephes_LOG2EF;
  afVar73 = ::_ps512_exp_lo;
  afVar72 = ::_ps512_exp_hi;
  afVar71 = ::_ps512_1;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    iVar83 = (this->super_InnerProduct).activation_type;
    iVar91 = local_f0 * local_dc;
    iVar94 = top_blob->elempack;
    uVar4 = top_blob->w;
    uVar101 = (ulong)uVar4;
    pvVar6 = (this->super_InnerProduct).bias_data.data;
    if (iVar94 == 1) {
      uVar101 = 0;
      local_88 = (ulong)(uint)((int)uVar4 >> 3);
      if ((int)uVar4 >> 3 < 1) {
        local_88 = uVar101;
      }
      local_c0 = (long)iVar91;
      local_90 = local_c0 * 0x20;
      lVar92 = local_c0 * 4;
      lVar100 = local_c0 * 0x18;
      local_118 = local_c0 * 0x1c;
      auVar138 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
      auVar139 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
      auVar144._8_4_ = 0x3f000000;
      auVar144._0_8_ = 0x3f0000003f000000;
      auVar144._12_4_ = 0x3f000000;
      auVar144._16_4_ = 0x3f000000;
      auVar144._20_4_ = 0x3f000000;
      auVar144._24_4_ = 0x3f000000;
      auVar144._28_4_ = 0x3f000000;
      auVar140 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
      auVar172 = ZEXT3264(auVar140);
      auVar145._8_4_ = 0x3f800000;
      auVar145._0_8_ = 0x3f8000003f800000;
      auVar145._12_4_ = 0x3f800000;
      auVar145._16_4_ = 0x3f800000;
      auVar145._20_4_ = 0x3f800000;
      auVar145._24_4_ = 0x3f800000;
      auVar145._28_4_ = 0x3f800000;
      auVar146._8_4_ = 0x3f318000;
      auVar146._0_8_ = 0x3f3180003f318000;
      auVar146._12_4_ = 0x3f318000;
      auVar146._16_4_ = 0x3f318000;
      auVar146._20_4_ = 0x3f318000;
      auVar146._24_4_ = 0x3f318000;
      auVar146._28_4_ = 0x3f318000;
      auVar147._8_4_ = 0x39506967;
      auVar147._0_8_ = 0x3950696739506967;
      auVar147._12_4_ = 0x39506967;
      auVar147._16_4_ = 0x39506967;
      auVar147._20_4_ = 0x39506967;
      auVar147._24_4_ = 0x39506967;
      auVar147._28_4_ = 0x39506967;
      auVar141 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
      auVar173 = ZEXT3264(auVar141);
      auVar142 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
      auVar175 = ZEXT3264(auVar142);
      auVar143 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
      auVar234._8_4_ = 0x3e2aaaaa;
      auVar234._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar234._12_4_ = 0x3e2aaaaa;
      auVar234._16_4_ = 0x3e2aaaaa;
      auVar234._20_4_ = 0x3e2aaaaa;
      auVar234._24_4_ = 0x3e2aaaaa;
      auVar234._28_4_ = 0x3e2aaaaa;
      auVar238._8_4_ = 0x3f800000;
      auVar238._0_8_ = 0x3f8000003f800000;
      auVar238._12_4_ = 0x3f800000;
      auVar238._16_4_ = 0x3f800000;
      auVar238._20_4_ = 0x3f800000;
      auVar238._24_4_ = 0x3f800000;
      auVar238._28_4_ = 0x3f800000;
      auVar242._8_4_ = 0xb95e8083;
      auVar242._0_8_ = 0xb95e8083b95e8083;
      auVar242._12_4_ = 0xb95e8083;
      auVar242._16_4_ = 0xb95e8083;
      auVar242._20_4_ = 0xb95e8083;
      auVar242._24_4_ = 0xb95e8083;
      auVar242._28_4_ = 0xb95e8083;
      auVar155 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
      auVar174 = ZEXT3264(auVar155);
      auVar156 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
      auVar157 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar158 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar159 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar160 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar103 = vxorps_avx512vl(auVar103,auVar103);
      auVar161 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
      auVar176 = ZEXT3264(auVar161);
      uVar85 = 0;
      lVar93 = local_c0 * 8;
      lVar97 = local_c0 * 0xc;
      lVar1 = local_c0 << 4;
      lVar89 = local_c0 * 0x14;
      while (lVar102 = lVar89, lVar99 = lVar1, lVar98 = lVar97, lVar95 = lVar93, uVar88 = uVar85,
            uVar88 != local_88) {
        local_80 = uVar88 * 8;
        auVar178 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar177 = ZEXT864(0);
        if (pvVar6 != (void *)0x0) {
          auVar177 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar6 + uVar88 * 0x20));
        }
        pvVar9 = (this->weight_data_tm).data;
        lVar97 = 0;
        lVar93 = 0;
        auVar181 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar251 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar248 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar249 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar250 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar179 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar180 = ZEXT1664(ZEXT816(0) << 0x40);
        iVar94 = 0;
        while( true ) {
          if (iVar91 <= iVar94 + 7) break;
          auVar163 = *(undefined1 (*) [32])(*local_108 + lVar93);
          auVar162 = vfmadd231ps_avx512vl
                               (auVar180._0_32_,auVar163,
                                *(undefined1 (*) [32])((long)pvVar9 + lVar93 + uVar101));
          auVar180 = ZEXT3264(auVar162);
          auVar162 = vfmadd231ps_avx512vl
                               (auVar179._0_32_,auVar163,
                                *(undefined1 (*) [32])((long)pvVar9 + lVar93 + lVar92));
          auVar179 = ZEXT3264(auVar162);
          auVar162 = vfmadd231ps_avx512vl
                               (auVar250._0_32_,auVar163,
                                *(undefined1 (*) [32])((long)pvVar9 + lVar93 + lVar95));
          auVar250 = ZEXT3264(auVar162);
          auVar162 = vfmadd231ps_avx512vl
                               (auVar249._0_32_,auVar163,
                                *(undefined1 (*) [32])((long)pvVar9 + lVar93 + lVar98));
          auVar249 = ZEXT3264(auVar162);
          auVar162 = vfmadd231ps_avx512vl
                               (auVar248._0_32_,auVar163,
                                *(undefined1 (*) [32])((long)pvVar9 + lVar93 + lVar99));
          auVar248 = ZEXT3264(auVar162);
          auVar162 = vfmadd231ps_avx512vl
                               (auVar251._0_32_,auVar163,
                                *(undefined1 (*) [32])((long)pvVar9 + lVar93 + lVar102));
          auVar251 = ZEXT3264(auVar162);
          auVar162 = vfmadd231ps_avx512vl
                               (auVar181._0_32_,auVar163,
                                *(undefined1 (*) [32])((long)pvVar9 + lVar93 + lVar100));
          auVar181 = ZEXT3264(auVar162);
          auVar163 = vfmadd231ps_avx512vl
                               (auVar178._0_32_,auVar163,
                                *(undefined1 (*) [32])((long)pvVar9 + lVar93 + local_118));
          auVar178 = ZEXT3264(auVar163);
          iVar94 = iVar94 + 8;
          lVar93 = lVar93 + 0x20;
          lVar97 = lVar97 + 8;
        }
        for (; (int)lVar97 < iVar91; lVar97 = lVar97 + 1) {
          auVar123 = vinsertps_avx512f(ZEXT416(*(uint *)((long)pvVar9 + lVar97 * 4 + lVar99)),
                                       ZEXT416(*(uint *)((long)pvVar9 + lVar97 * 4 + lVar102)),0x10)
          ;
          auVar123 = vinsertps_avx512f(auVar123,ZEXT416(*(uint *)((long)pvVar9 +
                                                                 lVar97 * 4 + lVar100)),0x20);
          auVar123 = vinsertps_avx512f(auVar123,ZEXT416(*(uint *)((long)pvVar9 +
                                                                 lVar97 * 4 + local_118)),0x30);
          auVar104 = vinsertps_avx512f(ZEXT416(*(uint *)((long)pvVar9 + lVar97 * 4 + uVar101)),
                                       ZEXT416(*(uint *)((long)pvVar9 + lVar97 * 4 + lVar92)),0x10);
          auVar104 = vinsertps_avx512f(auVar104,ZEXT416(*(uint *)((long)pvVar9 + lVar97 * 4 + lVar95
                                                                 )),0x20);
          auVar104 = vinsertps_avx512f(auVar104,ZEXT416(*(uint *)((long)pvVar9 + lVar97 * 4 + lVar98
                                                                 )),0x30);
          auVar162 = vinsertf32x4_avx512vl(ZEXT1632(auVar104),auVar123,1);
          uVar2 = *(undefined4 *)(*local_108 + lVar97 * 4);
          auVar163._4_4_ = uVar2;
          auVar163._0_4_ = uVar2;
          auVar163._8_4_ = uVar2;
          auVar163._12_4_ = uVar2;
          auVar163._16_4_ = uVar2;
          auVar163._20_4_ = uVar2;
          auVar163._24_4_ = uVar2;
          auVar163._28_4_ = uVar2;
          auVar163 = vfmadd231ps_avx512vl(auVar177._0_32_,auVar162,auVar163);
          auVar177 = ZEXT3264(auVar163);
        }
        auVar163 = vhaddps_avx(auVar180._0_32_,auVar179._0_32_);
        auVar162 = vhaddps_avx(auVar250._0_32_,auVar249._0_32_);
        auVar162 = vhaddps_avx(auVar163,auVar162);
        auVar163 = vhaddps_avx(auVar248._0_32_,auVar251._0_32_);
        auVar170 = vhaddps_avx(auVar181._0_32_,auVar178._0_32_);
        auVar170 = vhaddps_avx(auVar163,auVar170);
        auVar163 = vblendps_avx(auVar162,auVar170,0xf0);
        auVar162 = vperm2f128_avx(auVar162,auVar170,0x21);
        auVar170._0_4_ = auVar162._0_4_ + auVar177._0_4_ + auVar163._0_4_;
        auVar170._4_4_ = auVar162._4_4_ + auVar177._4_4_ + auVar163._4_4_;
        auVar170._8_4_ = auVar162._8_4_ + auVar177._8_4_ + auVar163._8_4_;
        auVar170._12_4_ = auVar162._12_4_ + auVar177._12_4_ + auVar163._12_4_;
        auVar170._16_4_ = auVar162._16_4_ + auVar177._16_4_ + auVar163._16_4_;
        auVar170._20_4_ = auVar162._20_4_ + auVar177._20_4_ + auVar163._20_4_;
        auVar170._24_4_ = auVar162._24_4_ + auVar177._24_4_ + auVar163._24_4_;
        auVar170._28_4_ = auVar162._28_4_ + auVar177._28_4_ + auVar163._28_4_;
        auVar162 = auVar170;
        if (5 < iVar83 - 1U) goto switchD_00293bb5_caseD_1;
        auVar162 = vmaxps_avx512vl(auVar170,ZEXT1632(auVar103));
        switch(iVar83) {
        case 2:
          auVar163 = vminps_avx512vl(auVar170,ZEXT1632(auVar103));
          uVar2 = *(this->super_InnerProduct).activation_params.data;
          auVar66._4_4_ = uVar2;
          auVar66._0_4_ = uVar2;
          auVar66._8_4_ = uVar2;
          auVar66._12_4_ = uVar2;
          auVar66._16_4_ = uVar2;
          auVar66._20_4_ = uVar2;
          auVar66._24_4_ = uVar2;
          auVar66._28_4_ = uVar2;
          auVar162 = vfmadd231ps_avx512vl(auVar162,auVar163,auVar66);
          break;
        case 3:
          puVar7 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar2 = *puVar7;
          auVar64._4_4_ = uVar2;
          auVar64._0_4_ = uVar2;
          auVar64._8_4_ = uVar2;
          auVar64._12_4_ = uVar2;
          auVar64._16_4_ = uVar2;
          auVar64._20_4_ = uVar2;
          auVar64._24_4_ = uVar2;
          auVar64._28_4_ = uVar2;
          auVar163 = vmaxps_avx512vl(auVar170,auVar64);
          uVar2 = puVar7[1];
          auVar65._4_4_ = uVar2;
          auVar65._0_4_ = uVar2;
          auVar65._8_4_ = uVar2;
          auVar65._12_4_ = uVar2;
          auVar65._16_4_ = uVar2;
          auVar65._20_4_ = uVar2;
          auVar65._24_4_ = uVar2;
          auVar65._28_4_ = uVar2;
          auVar162 = vminps_avx512vl(auVar163,auVar65);
          break;
        case 4:
          auVar62._8_4_ = 0x80000000;
          auVar62._0_8_ = 0x8000000080000000;
          auVar62._12_4_ = 0x80000000;
          auVar62._16_4_ = 0x80000000;
          auVar62._20_4_ = 0x80000000;
          auVar62._24_4_ = 0x80000000;
          auVar62._28_4_ = 0x80000000;
          auVar163 = vxorps_avx512vl(auVar170,auVar62);
          auVar163 = vminps_avx512vl(auVar163,auVar138);
          auVar162 = vmaxps_avx512vl(auVar163,auVar139);
          auVar170 = vfmadd231ps_avx512vl(auVar144,auVar162,auVar140);
          auVar163 = vroundps_avx(auVar170,1);
          uVar85 = vcmpps_avx512vl(auVar170,auVar163,1);
          auVar164 = vsubps_avx512vl(auVar163,auVar145);
          bVar13 = (bool)((byte)uVar85 & 1);
          auVar171._0_4_ = (float)((uint)bVar13 * auVar164._0_4_ | (uint)!bVar13 * auVar163._0_4_);
          bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
          auVar171._4_4_ = (float)((uint)bVar13 * auVar164._4_4_ | (uint)!bVar13 * auVar163._4_4_);
          bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
          auVar171._8_4_ = (float)((uint)bVar13 * auVar164._8_4_ | (uint)!bVar13 * auVar163._8_4_);
          bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
          auVar171._12_4_ =
               (float)((uint)bVar13 * auVar164._12_4_ | (uint)!bVar13 * auVar163._12_4_);
          bVar13 = (bool)((byte)(uVar85 >> 4) & 1);
          auVar171._16_4_ =
               (float)((uint)bVar13 * auVar164._16_4_ | (uint)!bVar13 * auVar163._16_4_);
          bVar13 = (bool)((byte)(uVar85 >> 5) & 1);
          auVar171._20_4_ =
               (float)((uint)bVar13 * auVar164._20_4_ | (uint)!bVar13 * auVar163._20_4_);
          bVar13 = (bool)((byte)(uVar85 >> 6) & 1);
          auVar171._24_4_ =
               (float)((uint)bVar13 * auVar164._24_4_ | (uint)!bVar13 * auVar163._24_4_);
          bVar13 = SUB81(uVar85 >> 7,0);
          auVar171._28_4_ =
               (float)((uint)bVar13 * auVar164._28_4_ | (uint)!bVar13 * auVar163._28_4_);
          auVar123 = vfmsub231ps_fma(auVar162,auVar171,auVar146);
          auVar63._8_4_ = 0x395e8083;
          auVar63._0_8_ = 0x395e8083395e8083;
          auVar63._12_4_ = 0x395e8083;
          auVar63._16_4_ = 0x395e8083;
          auVar63._20_4_ = 0x395e8083;
          auVar63._24_4_ = 0x395e8083;
          auVar63._28_4_ = 0x395e8083;
          auVar163 = vfmsub231ps_avx512vl(ZEXT1632(auVar123),auVar171,auVar63);
          auVar70._4_4_ = auVar163._4_4_ * auVar163._4_4_;
          auVar70._0_4_ = auVar163._0_4_ * auVar163._0_4_;
          auVar70._8_4_ = auVar163._8_4_ * auVar163._8_4_;
          auVar70._12_4_ = auVar163._12_4_ * auVar163._12_4_;
          auVar70._16_4_ = auVar163._16_4_ * auVar163._16_4_;
          auVar70._20_4_ = auVar163._20_4_ * auVar163._20_4_;
          auVar70._24_4_ = auVar163._24_4_ * auVar163._24_4_;
          auVar70._28_4_ = auVar170._28_4_;
          auVar162 = vfmadd213ps_avx512vl(auVar147,auVar163,auVar141);
          auVar162 = vfmadd213ps_avx512vl(auVar162,auVar163,auVar142);
          auVar162 = vfmadd213ps_avx512vl(auVar162,auVar163,auVar143);
          auVar123 = vfmadd213ps_fma(auVar162,auVar163,auVar234);
          auVar123 = vfmadd213ps_fma(ZEXT1632(auVar123),auVar163,auVar144);
          auVar123 = vfmadd213ps_fma(ZEXT1632(auVar123),auVar70,auVar163);
          auVar187._0_4_ = auVar123._0_4_ + 1.0;
          auVar187._4_4_ = auVar123._4_4_ + 1.0;
          auVar187._8_4_ = auVar123._8_4_ + 1.0;
          auVar187._12_4_ = auVar123._12_4_ + 1.0;
          auVar187._16_4_ = 0x3f800000;
          auVar187._20_4_ = 0x3f800000;
          auVar187._24_4_ = 0x3f800000;
          auVar187._28_4_ = 0x3f800000;
          auVar194._0_4_ = (int)auVar171._0_4_;
          auVar194._4_4_ = (int)auVar171._4_4_;
          auVar194._8_4_ = (int)auVar171._8_4_;
          auVar194._12_4_ = (int)auVar171._12_4_;
          auVar194._16_4_ = (int)auVar171._16_4_;
          auVar194._20_4_ = (int)auVar171._20_4_;
          auVar194._24_4_ = (int)auVar171._24_4_;
          auVar194._28_4_ = (int)auVar171._28_4_;
          auVar163 = vpslld_avx2(auVar194,0x17);
          auVar163 = vpaddd_avx2(auVar238,auVar163);
          auVar123 = vfmadd213ps_fma(auVar163,auVar187,auVar145);
          auVar162 = vdivps_avx(auVar145,ZEXT1632(auVar123));
          break;
        case 5:
          auVar163 = vminps_avx512vl(auVar170,auVar138);
          auVar162 = vmaxps_avx512vl(auVar163,auVar139);
          auVar123 = vfmadd213ps_fma(auVar140,auVar162,auVar144);
          auVar163 = vroundps_avx(ZEXT1632(auVar123),1);
          uVar85 = vcmpps_avx512vl(ZEXT1632(auVar123),auVar163,1);
          auVar164 = vsubps_avx512vl(auVar163,auVar145);
          bVar13 = (bool)((byte)uVar85 & 1);
          auVar165._0_4_ = (float)((uint)bVar13 * auVar164._0_4_ | (uint)!bVar13 * auVar163._0_4_);
          bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
          auVar165._4_4_ = (float)((uint)bVar13 * auVar164._4_4_ | (uint)!bVar13 * auVar163._4_4_);
          bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
          auVar165._8_4_ = (float)((uint)bVar13 * auVar164._8_4_ | (uint)!bVar13 * auVar163._8_4_);
          bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
          auVar165._12_4_ =
               (float)((uint)bVar13 * auVar164._12_4_ | (uint)!bVar13 * auVar163._12_4_);
          bVar13 = (bool)((byte)(uVar85 >> 4) & 1);
          auVar165._16_4_ =
               (float)((uint)bVar13 * auVar164._16_4_ | (uint)!bVar13 * auVar163._16_4_);
          bVar13 = (bool)((byte)(uVar85 >> 5) & 1);
          auVar165._20_4_ =
               (float)((uint)bVar13 * auVar164._20_4_ | (uint)!bVar13 * auVar163._20_4_);
          bVar13 = (bool)((byte)(uVar85 >> 6) & 1);
          auVar165._24_4_ =
               (float)((uint)bVar13 * auVar164._24_4_ | (uint)!bVar13 * auVar163._24_4_);
          bVar13 = SUB81(uVar85 >> 7,0);
          auVar165._28_4_ =
               (float)((uint)bVar13 * auVar164._28_4_ | (uint)!bVar13 * auVar163._28_4_);
          auVar123 = vfmsub231ps_fma(auVar162,auVar165,auVar146);
          auVar104 = vfnmsub231ps_fma(ZEXT1632(auVar123),auVar165,auVar242);
          auVar162 = ZEXT1632(auVar104);
          auVar163 = vfmadd213ps_avx512vl(auVar147,auVar162,auVar141);
          auVar163 = vfmadd213ps_avx512vl(auVar163,auVar162,auVar142);
          auVar163 = vfmadd213ps_avx512vl(auVar163,auVar162,auVar143);
          auVar162 = ZEXT1632(auVar104);
          auVar123 = vfmadd213ps_fma(auVar163,auVar162,auVar234);
          auVar123 = vfmadd213ps_fma(ZEXT1632(auVar123),auVar162,auVar144);
          auVar123 = vfmadd213ps_fma(ZEXT1632(auVar123),
                                     ZEXT1632(CONCAT412(auVar104._12_4_ * auVar104._12_4_,
                                                        CONCAT48(auVar104._8_4_ * auVar104._8_4_,
                                                                 CONCAT44(auVar104._4_4_ *
                                                                          auVar104._4_4_,
                                                                          auVar104._0_4_ *
                                                                          auVar104._0_4_)))),
                                     auVar162);
          auVar192._0_4_ = auVar123._0_4_ + 1.0;
          auVar192._4_4_ = auVar123._4_4_ + 1.0;
          auVar192._8_4_ = auVar123._8_4_ + 1.0;
          auVar192._12_4_ = auVar123._12_4_ + 1.0;
          auVar192._16_4_ = 0x3f800000;
          auVar192._20_4_ = 0x3f800000;
          auVar192._24_4_ = 0x3f800000;
          auVar192._28_4_ = 0x3f800000;
          auVar201._0_4_ = (int)auVar165._0_4_;
          auVar201._4_4_ = (int)auVar165._4_4_;
          auVar201._8_4_ = (int)auVar165._8_4_;
          auVar201._12_4_ = (int)auVar165._12_4_;
          auVar201._16_4_ = (int)auVar165._16_4_;
          auVar201._20_4_ = (int)auVar165._20_4_;
          auVar201._24_4_ = (int)auVar165._24_4_;
          auVar201._28_4_ = (int)auVar165._28_4_;
          auVar163 = vpslld_avx2(auVar201,0x17);
          auVar163 = vpaddd_avx2(auVar238,auVar163);
          auVar123 = vfmadd213ps_fma(auVar163,auVar192,auVar145);
          uVar85 = vcmpps_avx512vl(ZEXT1632(auVar123),ZEXT1632(auVar103),2);
          auVar54._8_4_ = 0x800000;
          auVar54._0_8_ = 0x80000000800000;
          auVar54._12_4_ = 0x800000;
          auVar54._16_4_ = 0x800000;
          auVar54._20_4_ = 0x800000;
          auVar54._24_4_ = 0x800000;
          auVar54._28_4_ = 0x800000;
          auVar163 = vmaxps_avx512vl(ZEXT1632(auVar123),auVar54);
          auVar202 = vpsrld_avx2(auVar163,0x17);
          auVar207._8_4_ = 0x807fffff;
          auVar207._0_8_ = 0x807fffff807fffff;
          auVar207._12_4_ = 0x807fffff;
          auVar207._16_4_ = 0x807fffff;
          auVar207._20_4_ = 0x807fffff;
          auVar207._24_4_ = 0x807fffff;
          auVar207._28_4_ = 0x807fffff;
          auVar55._8_4_ = 0x3f000000;
          auVar55._0_8_ = 0x3f0000003f000000;
          auVar55._12_4_ = 0x3f000000;
          auVar55._16_4_ = 0x3f000000;
          auVar55._20_4_ = 0x3f000000;
          auVar55._24_4_ = 0x3f000000;
          auVar55._28_4_ = 0x3f000000;
          auVar163 = vpternlogd_avx512vl(auVar163,auVar207,auVar55,0xea);
          auVar56._8_4_ = 0x3f3504f3;
          auVar56._0_8_ = 0x3f3504f33f3504f3;
          auVar56._12_4_ = 0x3f3504f3;
          auVar56._16_4_ = 0x3f3504f3;
          auVar56._20_4_ = 0x3f3504f3;
          auVar56._24_4_ = 0x3f3504f3;
          auVar56._28_4_ = 0x3f3504f3;
          uVar15 = vcmpps_avx512vl(auVar163,auVar56,1);
          auVar162 = vaddps_avx512vl(auVar163,auVar155);
          auVar164 = vaddps_avx512vl(auVar162,auVar163);
          bVar13 = (bool)((byte)uVar15 & 1);
          auVar166._0_4_ = (float)((uint)bVar13 * auVar164._0_4_ | (uint)!bVar13 * auVar162._0_4_);
          bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
          auVar166._4_4_ = (float)((uint)bVar13 * auVar164._4_4_ | (uint)!bVar13 * auVar162._4_4_);
          bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
          auVar166._8_4_ = (float)((uint)bVar13 * auVar164._8_4_ | (uint)!bVar13 * auVar162._8_4_);
          bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
          auVar166._12_4_ =
               (float)((uint)bVar13 * auVar164._12_4_ | (uint)!bVar13 * auVar162._12_4_);
          bVar13 = (bool)((byte)(uVar15 >> 4) & 1);
          auVar166._16_4_ =
               (float)((uint)bVar13 * auVar164._16_4_ | (uint)!bVar13 * auVar162._16_4_);
          bVar13 = (bool)((byte)(uVar15 >> 5) & 1);
          auVar166._20_4_ =
               (float)((uint)bVar13 * auVar164._20_4_ | (uint)!bVar13 * auVar162._20_4_);
          bVar13 = (bool)((byte)(uVar15 >> 6) & 1);
          auVar166._24_4_ =
               (float)((uint)bVar13 * auVar164._24_4_ | (uint)!bVar13 * auVar162._24_4_);
          bVar13 = SUB81(uVar15 >> 7,0);
          auVar166._28_4_ = (uint)bVar13 * auVar164._28_4_ | (uint)!bVar13 * auVar162._28_4_;
          auVar68._4_4_ = auVar166._4_4_ * auVar166._4_4_;
          auVar68._0_4_ = auVar166._0_4_ * auVar166._0_4_;
          auVar68._8_4_ = auVar166._8_4_ * auVar166._8_4_;
          auVar68._12_4_ = auVar166._12_4_ * auVar166._12_4_;
          auVar68._16_4_ = auVar166._16_4_ * auVar166._16_4_;
          auVar68._20_4_ = auVar166._20_4_ * auVar166._20_4_;
          auVar68._24_4_ = auVar166._24_4_ * auVar166._24_4_;
          auVar68._28_4_ = auVar163._28_4_;
          auVar57._8_4_ = 0xbdebd1b8;
          auVar57._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar57._12_4_ = 0xbdebd1b8;
          auVar57._16_4_ = 0xbdebd1b8;
          auVar57._20_4_ = 0xbdebd1b8;
          auVar57._24_4_ = 0xbdebd1b8;
          auVar57._28_4_ = 0xbdebd1b8;
          auVar163 = vfmadd213ps_avx512vl(auVar156,auVar166,auVar57);
          auVar58._8_4_ = 0x3def251a;
          auVar58._0_8_ = 0x3def251a3def251a;
          auVar58._12_4_ = 0x3def251a;
          auVar58._16_4_ = 0x3def251a;
          auVar58._20_4_ = 0x3def251a;
          auVar58._24_4_ = 0x3def251a;
          auVar58._28_4_ = 0x3def251a;
          auVar163 = vfmadd213ps_avx512vl(auVar163,auVar166,auVar58);
          auVar59._8_4_ = 0xbdfe5d4f;
          auVar59._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar59._12_4_ = 0xbdfe5d4f;
          auVar59._16_4_ = 0xbdfe5d4f;
          auVar59._20_4_ = 0xbdfe5d4f;
          auVar59._24_4_ = 0xbdfe5d4f;
          auVar59._28_4_ = 0xbdfe5d4f;
          auVar163 = vfmadd213ps_avx512vl(auVar163,auVar166,auVar59);
          auVar60._8_4_ = 0x3e11e9bf;
          auVar60._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar60._12_4_ = 0x3e11e9bf;
          auVar60._16_4_ = 0x3e11e9bf;
          auVar60._20_4_ = 0x3e11e9bf;
          auVar60._24_4_ = 0x3e11e9bf;
          auVar60._28_4_ = 0x3e11e9bf;
          auVar163 = vfmadd213ps_avx512vl(auVar163,auVar166,auVar60);
          auVar163 = vfmadd213ps_avx512vl(auVar163,auVar166,auVar157);
          auVar163 = vfmadd213ps_avx512vl(auVar163,auVar166,auVar158);
          auVar163 = vfmadd213ps_avx512vl(auVar163,auVar166,auVar159);
          auVar163 = vfmadd213ps_avx512vl(auVar163,auVar166,auVar160);
          auVar69._4_4_ = auVar166._4_4_ * auVar166._4_4_ * auVar166._4_4_ * auVar163._4_4_;
          auVar69._0_4_ = auVar166._0_4_ * auVar166._0_4_ * auVar166._0_4_ * auVar163._0_4_;
          auVar69._8_4_ = auVar166._8_4_ * auVar166._8_4_ * auVar166._8_4_ * auVar163._8_4_;
          auVar69._12_4_ = auVar166._12_4_ * auVar166._12_4_ * auVar166._12_4_ * auVar163._12_4_;
          auVar69._16_4_ = auVar166._16_4_ * auVar166._16_4_ * auVar166._16_4_ * auVar163._16_4_;
          auVar69._20_4_ = auVar166._20_4_ * auVar166._20_4_ * auVar166._20_4_ * auVar163._20_4_;
          auVar69._24_4_ = auVar166._24_4_ * auVar166._24_4_ * auVar166._24_4_ * auVar163._24_4_;
          auVar69._28_4_ = auVar163._28_4_;
          auVar61._8_4_ = 0xffffff82;
          auVar61._0_8_ = 0xffffff82ffffff82;
          auVar61._12_4_ = 0xffffff82;
          auVar61._16_4_ = 0xffffff82;
          auVar61._20_4_ = 0xffffff82;
          auVar61._24_4_ = 0xffffff82;
          auVar61._28_4_ = 0xffffff82;
          auVar163 = vpaddd_avx512vl(auVar202,auVar61);
          auVar163 = vcvtdq2ps_avx(auVar163);
          auVar162 = vsubps_avx512vl(auVar163,auVar145);
          bVar13 = (bool)((byte)uVar15 & 1);
          auVar167._0_4_ = (uint)bVar13 * auVar162._0_4_ | (uint)!bVar13 * auVar163._0_4_;
          bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
          auVar167._4_4_ = (uint)bVar13 * auVar162._4_4_ | (uint)!bVar13 * auVar163._4_4_;
          bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
          auVar167._8_4_ = (uint)bVar13 * auVar162._8_4_ | (uint)!bVar13 * auVar163._8_4_;
          bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
          auVar167._12_4_ = (uint)bVar13 * auVar162._12_4_ | (uint)!bVar13 * auVar163._12_4_;
          bVar13 = (bool)((byte)(uVar15 >> 4) & 1);
          auVar167._16_4_ = (uint)bVar13 * auVar162._16_4_ | (uint)!bVar13 * auVar163._16_4_;
          bVar13 = (bool)((byte)(uVar15 >> 5) & 1);
          auVar167._20_4_ = (uint)bVar13 * auVar162._20_4_ | (uint)!bVar13 * auVar163._20_4_;
          bVar13 = (bool)((byte)(uVar15 >> 6) & 1);
          auVar167._24_4_ = (uint)bVar13 * auVar162._24_4_ | (uint)!bVar13 * auVar163._24_4_;
          bVar13 = SUB81(uVar15 >> 7,0);
          auVar167._28_4_ = (uint)bVar13 * auVar162._28_4_ | (uint)!bVar13 * auVar163._28_4_;
          auVar123 = vfmadd231ps_fma(auVar69,auVar167,auVar242);
          auVar123 = vfmsub231ps_fma(ZEXT1632(auVar123),auVar144,auVar68);
          auVar163 = vsubps_avx(ZEXT1632(auVar123),auVar166);
          auVar123 = vfmsub231ps_fma(auVar163,auVar146,auVar167);
          auVar163 = vmulps_avx512vl(ZEXT1632(auVar123),auVar161);
          auVar162 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          bVar13 = (bool)((byte)uVar85 & 1);
          auVar168._0_4_ = (uint)bVar13 * auVar162._0_4_ | (uint)!bVar13 * auVar163._0_4_;
          bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
          auVar168._4_4_ = (uint)bVar13 * auVar162._4_4_ | (uint)!bVar13 * auVar163._4_4_;
          bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
          auVar168._8_4_ = (uint)bVar13 * auVar162._8_4_ | (uint)!bVar13 * auVar163._8_4_;
          bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
          auVar168._12_4_ = (uint)bVar13 * auVar162._12_4_ | (uint)!bVar13 * auVar163._12_4_;
          bVar13 = (bool)((byte)(uVar85 >> 4) & 1);
          auVar168._16_4_ = (uint)bVar13 * auVar162._16_4_ | (uint)!bVar13 * auVar163._16_4_;
          bVar13 = (bool)((byte)(uVar85 >> 5) & 1);
          auVar168._20_4_ = (uint)bVar13 * auVar162._20_4_ | (uint)!bVar13 * auVar163._20_4_;
          bVar13 = (bool)((byte)(uVar85 >> 6) & 1);
          auVar168._24_4_ = (uint)bVar13 * auVar162._24_4_ | (uint)!bVar13 * auVar163._24_4_;
          bVar13 = SUB81(uVar85 >> 7,0);
          auVar168._28_4_ = (uint)bVar13 * auVar162._28_4_ | (uint)!bVar13 * auVar163._28_4_;
          auVar163 = vminps_avx512vl(auVar168,auVar138);
          auVar162 = vmaxps_avx512vl(auVar163,auVar139);
          auVar123 = vfmadd213ps_fma(auVar140,auVar162,auVar144);
          auVar163 = vroundps_avx(ZEXT1632(auVar123),1);
          uVar85 = vcmpps_avx512vl(ZEXT1632(auVar123),auVar163,1);
          auVar164 = vsubps_avx512vl(auVar163,auVar145);
          bVar13 = (bool)((byte)uVar85 & 1);
          auVar169._0_4_ = (float)((uint)bVar13 * auVar164._0_4_ | (uint)!bVar13 * auVar163._0_4_);
          bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
          auVar169._4_4_ = (float)((uint)bVar13 * auVar164._4_4_ | (uint)!bVar13 * auVar163._4_4_);
          bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
          auVar169._8_4_ = (float)((uint)bVar13 * auVar164._8_4_ | (uint)!bVar13 * auVar163._8_4_);
          bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
          auVar169._12_4_ =
               (float)((uint)bVar13 * auVar164._12_4_ | (uint)!bVar13 * auVar163._12_4_);
          bVar13 = (bool)((byte)(uVar85 >> 4) & 1);
          auVar169._16_4_ =
               (float)((uint)bVar13 * auVar164._16_4_ | (uint)!bVar13 * auVar163._16_4_);
          bVar13 = (bool)((byte)(uVar85 >> 5) & 1);
          auVar169._20_4_ =
               (float)((uint)bVar13 * auVar164._20_4_ | (uint)!bVar13 * auVar163._20_4_);
          bVar13 = (bool)((byte)(uVar85 >> 6) & 1);
          auVar169._24_4_ =
               (float)((uint)bVar13 * auVar164._24_4_ | (uint)!bVar13 * auVar163._24_4_);
          bVar13 = SUB81(uVar85 >> 7,0);
          auVar169._28_4_ =
               (float)((uint)bVar13 * auVar164._28_4_ | (uint)!bVar13 * auVar163._28_4_);
          auVar123 = vfmsub231ps_fma(auVar162,auVar169,auVar146);
          auVar104 = vfnmsub231ps_fma(ZEXT1632(auVar123),auVar169,auVar242);
          auVar162 = ZEXT1632(auVar104);
          auVar163 = vfmadd213ps_avx512vl(auVar147,auVar162,auVar141);
          auVar163 = vfmadd213ps_avx512vl(auVar163,auVar162,auVar142);
          auVar163 = vfmadd213ps_avx512vl(auVar163,auVar162,auVar143);
          auVar162 = ZEXT1632(auVar104);
          auVar123 = vfmadd213ps_fma(auVar163,auVar162,auVar234);
          auVar123 = vfmadd213ps_fma(ZEXT1632(auVar123),auVar162,auVar144);
          auVar123 = vfmadd213ps_fma(ZEXT1632(auVar123),
                                     ZEXT1632(CONCAT412(auVar104._12_4_ * auVar104._12_4_,
                                                        CONCAT48(auVar104._8_4_ * auVar104._8_4_,
                                                                 CONCAT44(auVar104._4_4_ *
                                                                          auVar104._4_4_,
                                                                          auVar104._0_4_ *
                                                                          auVar104._0_4_)))),
                                     auVar162);
          auVar193._0_4_ = auVar123._0_4_ + 1.0;
          auVar193._4_4_ = auVar123._4_4_ + 1.0;
          auVar193._8_4_ = auVar123._8_4_ + 1.0;
          auVar193._12_4_ = auVar123._12_4_ + 1.0;
          auVar193._16_4_ = 0x3f800000;
          auVar193._20_4_ = 0x3f800000;
          auVar193._24_4_ = 0x3f800000;
          auVar193._28_4_ = 0x3f800000;
          auVar203._0_4_ = (int)auVar169._0_4_;
          auVar203._4_4_ = (int)auVar169._4_4_;
          auVar203._8_4_ = (int)auVar169._8_4_;
          auVar203._12_4_ = (int)auVar169._12_4_;
          auVar203._16_4_ = (int)auVar169._16_4_;
          auVar203._20_4_ = (int)auVar169._20_4_;
          auVar203._24_4_ = (int)auVar169._24_4_;
          auVar203._28_4_ = (int)auVar169._28_4_;
          auVar163 = vpslld_avx2(auVar203,0x17);
          auVar163 = vpaddd_avx2(auVar238,auVar163);
          auVar123 = vfmadd213ps_fma(auVar163,auVar193,auVar145);
          auVar163 = vdivps_avx(auVar145,ZEXT1632(auVar123));
          auVar163 = vfnmadd213ps_avx512vl(auVar163,auVar161,auVar155);
          goto LAB_00293e4b;
        case 6:
          puVar7 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar2 = *puVar7;
          auVar202._4_4_ = uVar2;
          auVar202._0_4_ = uVar2;
          auVar202._8_4_ = uVar2;
          auVar202._12_4_ = uVar2;
          auVar202._16_4_ = uVar2;
          auVar202._20_4_ = uVar2;
          auVar202._24_4_ = uVar2;
          auVar202._28_4_ = uVar2;
          uVar2 = puVar7[1];
          auVar164._4_4_ = uVar2;
          auVar164._0_4_ = uVar2;
          auVar164._8_4_ = uVar2;
          auVar164._12_4_ = uVar2;
          auVar164._16_4_ = uVar2;
          auVar164._20_4_ = uVar2;
          auVar164._24_4_ = uVar2;
          auVar164._28_4_ = uVar2;
          auVar163 = vfmadd213ps_avx512vl(auVar202,auVar170,auVar164);
          auVar163 = vmaxps_avx512vl(auVar163,ZEXT1632(auVar103));
          auVar163 = vminps_avx(auVar163,auVar145);
LAB_00293e4b:
          auVar162._4_4_ = auVar163._4_4_ * auVar170._4_4_;
          auVar162._0_4_ = auVar163._0_4_ * auVar170._0_4_;
          auVar162._8_4_ = auVar163._8_4_ * auVar170._8_4_;
          auVar162._12_4_ = auVar163._12_4_ * auVar170._12_4_;
          auVar162._16_4_ = auVar163._16_4_ * auVar170._16_4_;
          auVar162._20_4_ = auVar163._20_4_ * auVar170._20_4_;
          auVar162._24_4_ = auVar163._24_4_ * auVar170._24_4_;
          auVar162._28_4_ = auVar163._28_4_;
        }
switchD_00293bb5_caseD_1:
        *(undefined1 (*) [32])((long)top_blob->data + uVar88 * 0x20) = auVar162;
        uVar101 = uVar101 + local_90;
        lVar92 = lVar92 + local_90;
        lVar100 = lVar100 + local_90;
        local_118 = local_118 + local_90;
        lVar93 = lVar95 + local_90;
        lVar97 = lVar98 + local_90;
        lVar1 = lVar99 + local_90;
        lVar89 = lVar102 + local_90;
        local_b8 = uVar88;
        local_b0 = lVar102;
        local_a8 = lVar99;
        local_a0 = lVar98;
        local_98 = lVar95;
        uVar85 = uVar88 + 1;
      }
      uVar101 = (long)(int)uVar4 & 0xfffffffffffffff8;
      uVar84 = uVar4 >> 2 & 1;
      lVar92 = local_c0 * uVar101 * 4;
      lVar93 = local_c0 * 0x10;
      lVar97 = (uVar101 + 1) * local_c0 * 4;
      local_118 = (uVar101 + 2) * local_c0 * 4;
      local_120 = (uVar101 + 3) * local_c0 * 4;
      uVar85 = 0;
      auVar185 = ZEXT816(0);
      auVar103 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
      auVar123 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
      auVar115._8_4_ = 0x3f000000;
      auVar115._0_8_ = 0x3f0000003f000000;
      auVar115._12_4_ = 0x3f000000;
      auVar111._8_4_ = 0x3fb8aa3b;
      auVar111._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar111._12_4_ = 0x3fb8aa3b;
      auVar112._8_4_ = 0x3f800000;
      auVar112._0_8_ = 0x3f8000003f800000;
      auVar112._12_4_ = 0x3f800000;
      auVar113._8_4_ = 0x3f318000;
      auVar113._0_8_ = 0x3f3180003f318000;
      auVar113._12_4_ = 0x3f318000;
      auVar114._8_4_ = 0x39506967;
      auVar114._0_8_ = 0x3950696739506967;
      auVar114._12_4_ = 0x39506967;
      auVar223._8_4_ = 0x3ab743ce;
      auVar223._0_8_ = 0x3ab743ce3ab743ce;
      auVar223._12_4_ = 0x3ab743ce;
      auVar226._8_4_ = 0x3c088908;
      auVar226._0_8_ = 0x3c0889083c088908;
      auVar226._12_4_ = 0x3c088908;
      auVar229._8_4_ = 0x3d2aa9c1;
      auVar229._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar229._12_4_ = 0x3d2aa9c1;
      auVar232._8_4_ = 0x3e2aaaaa;
      auVar232._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar232._12_4_ = 0x3e2aaaaa;
      auVar236._8_4_ = 0x3f800000;
      auVar236._0_8_ = 0x3f8000003f800000;
      auVar236._12_4_ = 0x3f800000;
      auVar240._8_4_ = 0xb95e8083;
      auVar240._0_8_ = 0xb95e8083b95e8083;
      auVar240._12_4_ = 0xb95e8083;
      auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
      auVar105 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
      auVar106 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
      auVar107 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar109 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar124 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
      for (; uVar85 != uVar84; uVar85 = uVar85 + 1) {
        lVar1 = uVar101 + uVar85 * 4;
        if (pvVar6 == (void *)0x0) {
          auVar129 = vxorps_avx512vl(auVar176._0_16_,auVar176._0_16_);
        }
        else {
          auVar129 = *(undefined1 (*) [16])((long)pvVar6 + lVar1 * 4);
        }
        pvVar9 = (this->weight_data_tm).data;
        lVar100 = 0;
        auVar178 = ZEXT1664(ZEXT816(0) << 0x40);
        lVar89 = 0;
        auVar251 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar176 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar177 = ZEXT1664(ZEXT816(0) << 0x40);
        iVar94 = 0;
        while( true ) {
          if (iVar91 <= iVar94 + 7) break;
          auVar138 = *(undefined1 (*) [32])(*local_108 + lVar89);
          auVar172 = ZEXT3264(auVar138);
          auVar139 = vfmadd231ps_avx512vl
                               (auVar178._0_32_,auVar138,
                                *(undefined1 (*) [32])((long)pvVar9 + lVar89 + lVar92));
          auVar178 = ZEXT3264(auVar139);
          auVar139 = vfmadd231ps_avx512vl
                               (auVar251._0_32_,auVar138,
                                *(undefined1 (*) [32])((long)pvVar9 + lVar89 + lVar97));
          auVar251 = ZEXT3264(auVar139);
          auVar139 = vfmadd231ps_avx512vl
                               (auVar176._0_32_,auVar138,
                                *(undefined1 (*) [32])((long)pvVar9 + lVar89 + local_118));
          auVar176 = ZEXT3264(auVar139);
          auVar138 = vfmadd231ps_avx512vl
                               (auVar177._0_32_,auVar138,
                                *(undefined1 (*) [32])((long)pvVar9 + lVar89 + local_120));
          auVar177 = ZEXT3264(auVar138);
          iVar94 = iVar94 + 8;
          lVar89 = lVar89 + 0x20;
          lVar100 = lVar100 + 8;
        }
        auVar125 = vxorps_avx512vl(auVar172._0_16_,auVar172._0_16_);
        auVar126 = vxorps_avx512vl(auVar173._0_16_,auVar173._0_16_);
        auVar127 = vxorps_avx512vl(auVar174._0_16_,auVar174._0_16_);
        auVar128 = vxorps_avx512vl(auVar175._0_16_,auVar175._0_16_);
        for (; auVar175 = ZEXT1664(auVar128), iVar94 + 3 < iVar91; iVar94 = iVar94 + 4) {
          auVar130 = *(undefined1 (*) [16])(*local_108 + lVar89);
          auVar125 = vfmadd231ps_avx512vl
                               (auVar125,auVar130,
                                *(undefined1 (*) [16])((long)pvVar9 + lVar89 + lVar92));
          auVar126 = vfmadd231ps_avx512vl
                               (auVar126,auVar130,
                                *(undefined1 (*) [16])((long)pvVar9 + lVar89 + lVar97));
          auVar127 = vfmadd231ps_avx512vl
                               (auVar127,auVar130,
                                *(undefined1 (*) [16])((long)pvVar9 + lVar89 + local_118));
          auVar128 = vfmadd231ps_avx512vl
                               (auVar128,auVar130,
                                *(undefined1 (*) [16])((long)pvVar9 + lVar89 + local_120));
          lVar89 = lVar89 + 0x10;
          lVar100 = lVar100 + 4;
        }
        for (; (int)lVar100 < iVar91; lVar100 = lVar100 + 1) {
          auVar130 = vinsertps_avx512f(ZEXT416(*(uint *)((long)pvVar9 + lVar100 * 4 + lVar92)),
                                       ZEXT416(*(uint *)((long)pvVar9 + lVar100 * 4 + lVar97)),0x10)
          ;
          auVar130 = vinsertps_avx512f(auVar130,ZEXT416(*(uint *)((long)pvVar9 +
                                                                 lVar100 * 4 + local_118)),0x20);
          auVar130 = vinsertps_avx512f(auVar130,ZEXT416(*(uint *)((long)pvVar9 +
                                                                 lVar100 * 4 + local_120)),0x30);
          uVar2 = *(undefined4 *)(*local_108 + lVar100 * 4);
          auVar131._4_4_ = uVar2;
          auVar131._0_4_ = uVar2;
          auVar131._8_4_ = uVar2;
          auVar131._12_4_ = uVar2;
          auVar129 = vfmadd231ps_avx512vl(auVar129,auVar130,auVar131);
        }
        auVar138 = vhaddps_avx(auVar178._0_32_,auVar251._0_32_);
        auVar139 = vhaddps_avx(auVar176._0_32_,auVar177._0_32_);
        auVar138 = vhaddps_avx(auVar138,auVar139);
        auVar130 = vunpcklps_avx512vl(auVar125,auVar126);
        auVar131 = vunpcklps_avx512vl(auVar127,auVar128);
        auVar126 = vunpckhps_avx512vl(auVar125,auVar126);
        auVar125 = vunpckhps_avx512vl(auVar127,auVar128);
        auVar173 = ZEXT1664(auVar125);
        auVar127 = vmovlhps_avx512f(auVar130,auVar131);
        auVar174 = ZEXT1664(auVar127);
        auVar128 = vunpckhpd_avx(auVar130,auVar131);
        auVar127 = vaddps_avx512vl(auVar128,auVar127);
        auVar128 = vmovlhps_avx512f(auVar126,auVar125);
        auVar126 = vunpckhpd_avx512vl(auVar126,auVar125);
        auVar172 = ZEXT1664(auVar126);
        auVar128 = vaddps_avx512vl(auVar128,auVar126);
        auVar126._0_4_ = auVar128._0_4_ + auVar127._0_4_;
        auVar126._4_4_ = auVar128._4_4_ + auVar127._4_4_;
        auVar126._8_4_ = auVar128._8_4_ + auVar127._8_4_;
        auVar126._12_4_ = auVar128._12_4_ + auVar127._12_4_;
        auVar129 = vaddps_avx512vl(auVar126,auVar129);
        auVar128._0_4_ = auVar129._0_4_ + auVar138._0_4_;
        auVar128._4_4_ = auVar129._4_4_ + auVar138._4_4_;
        auVar128._8_4_ = auVar129._8_4_ + auVar138._8_4_;
        auVar128._12_4_ = auVar129._12_4_ + auVar138._12_4_;
        auVar128 = vaddps_avx512vl(auVar128,auVar138._16_16_);
        auVar176 = ZEXT1664(auVar128);
        auVar129 = auVar128;
        if (iVar83 - 1U < 6) {
          auVar129 = vmaxps_avx512vl(auVar128,auVar185);
          switch(iVar83) {
          case 2:
            auVar128 = vminps_avx512vl(auVar128,auVar185);
            uVar2 = *(this->super_InnerProduct).activation_params.data;
            auVar39._4_4_ = uVar2;
            auVar39._0_4_ = uVar2;
            auVar39._8_4_ = uVar2;
            auVar39._12_4_ = uVar2;
            auVar129 = vfmadd231ps_avx512vl(auVar129,auVar128,auVar39);
            break;
          case 3:
            puVar7 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar2 = *puVar7;
            auVar37._4_4_ = uVar2;
            auVar37._0_4_ = uVar2;
            auVar37._8_4_ = uVar2;
            auVar37._12_4_ = uVar2;
            auVar129 = vmaxps_avx512vl(auVar128,auVar37);
            uVar2 = puVar7[1];
            auVar38._4_4_ = uVar2;
            auVar38._0_4_ = uVar2;
            auVar38._8_4_ = uVar2;
            auVar38._12_4_ = uVar2;
            auVar129 = vminps_avx512vl(auVar129,auVar38);
            break;
          case 4:
            auVar35._8_4_ = 0x80000000;
            auVar35._0_8_ = 0x8000000080000000;
            auVar35._12_4_ = 0x80000000;
            auVar129 = vxorps_avx512vl(auVar128,auVar35);
            auVar129 = vminps_avx512vl(auVar129,auVar103);
            auVar127 = vmaxps_avx512vl(auVar129,auVar123);
            auVar128 = vfmadd231ps_fma(auVar115,auVar127,auVar111);
            auVar216._0_4_ = (int)auVar128._0_4_;
            auVar216._4_4_ = (int)auVar128._4_4_;
            auVar216._8_4_ = (int)auVar128._8_4_;
            auVar216._12_4_ = (int)auVar128._12_4_;
            auVar129 = vcvtdq2ps_avx(auVar216);
            uVar88 = vcmpps_avx512vl(auVar128,auVar129,1);
            auVar128 = vsubps_avx512vl(auVar129,auVar112);
            bVar13 = (bool)((byte)uVar88 & 1);
            auVar137._0_4_ = (float)((uint)bVar13 * auVar128._0_4_ | (uint)!bVar13 * auVar129._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
            auVar137._4_4_ = (float)((uint)bVar13 * auVar128._4_4_ | (uint)!bVar13 * auVar129._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar88 >> 2) & 1);
            auVar137._8_4_ = (float)((uint)bVar13 * auVar128._8_4_ | (uint)!bVar13 * auVar129._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar137._12_4_ =
                 (float)((uint)bVar13 * auVar128._12_4_ | (uint)!bVar13 * auVar129._12_4_);
            auVar129 = vfmsub231ps_fma(auVar127,auVar137,auVar113);
            auVar36._8_4_ = 0x395e8083;
            auVar36._0_8_ = 0x395e8083395e8083;
            auVar36._12_4_ = 0x395e8083;
            auVar128 = vfmsub231ps_avx512vl(auVar129,auVar137,auVar36);
            auVar199._0_4_ = auVar128._0_4_ * auVar128._0_4_;
            auVar199._4_4_ = auVar128._4_4_ * auVar128._4_4_;
            auVar199._8_4_ = auVar128._8_4_ * auVar128._8_4_;
            auVar199._12_4_ = auVar128._12_4_ * auVar128._12_4_;
            auVar129 = vfmadd213ps_fma(auVar114,auVar128,auVar223);
            auVar129 = vfmadd213ps_fma(auVar129,auVar128,auVar226);
            auVar129 = vfmadd213ps_fma(auVar129,auVar128,auVar229);
            auVar129 = vfmadd213ps_fma(auVar129,auVar128,auVar232);
            auVar129 = vfmadd213ps_fma(auVar129,auVar128,auVar115);
            auVar129 = vfmadd213ps_fma(auVar129,auVar199,auVar128);
            auVar191._0_4_ = auVar129._0_4_ + 1.0;
            auVar191._4_4_ = auVar129._4_4_ + 1.0;
            auVar191._8_4_ = auVar129._8_4_ + 1.0;
            auVar191._12_4_ = auVar129._12_4_ + 1.0;
            auVar200._0_4_ = (int)auVar137._0_4_;
            auVar200._4_4_ = (int)auVar137._4_4_;
            auVar200._8_4_ = (int)auVar137._8_4_;
            auVar200._12_4_ = (int)auVar137._12_4_;
            auVar129 = vpslld_avx(auVar200,0x17);
            auVar129 = vpaddd_avx(auVar236,auVar129);
            auVar129 = vfmadd213ps_fma(auVar129,auVar191,auVar112);
            auVar129 = vdivps_avx(auVar112,auVar129);
            break;
          case 5:
            auVar129 = vminps_avx512vl(auVar128,auVar103);
            auVar126 = vmaxps_avx512vl(auVar129,auVar123);
            auVar127 = vfmadd213ps_fma(auVar111,auVar126,auVar115);
            auVar213._0_4_ = (int)auVar127._0_4_;
            auVar213._4_4_ = (int)auVar127._4_4_;
            auVar213._8_4_ = (int)auVar127._8_4_;
            auVar213._12_4_ = (int)auVar127._12_4_;
            auVar129 = vcvtdq2ps_avx(auVar213);
            uVar88 = vcmpps_avx512vl(auVar127,auVar129,1);
            auVar127 = vsubps_avx512vl(auVar129,auVar112);
            bVar13 = (bool)((byte)uVar88 & 1);
            auVar132._0_4_ = (float)((uint)bVar13 * auVar127._0_4_ | (uint)!bVar13 * auVar129._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
            auVar132._4_4_ = (float)((uint)bVar13 * auVar127._4_4_ | (uint)!bVar13 * auVar129._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar88 >> 2) & 1);
            auVar132._8_4_ = (float)((uint)bVar13 * auVar127._8_4_ | (uint)!bVar13 * auVar129._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar132._12_4_ =
                 (float)((uint)bVar13 * auVar127._12_4_ | (uint)!bVar13 * auVar129._12_4_);
            auVar129 = vfmsub231ps_fma(auVar126,auVar132,auVar113);
            auVar127 = vfnmsub231ps_fma(auVar129,auVar132,auVar240);
            auVar195._0_4_ = auVar127._0_4_ * auVar127._0_4_;
            auVar195._4_4_ = auVar127._4_4_ * auVar127._4_4_;
            auVar195._8_4_ = auVar127._8_4_ * auVar127._8_4_;
            auVar195._12_4_ = auVar127._12_4_ * auVar127._12_4_;
            auVar129 = vfmadd213ps_fma(auVar114,auVar127,auVar223);
            auVar129 = vfmadd213ps_fma(auVar129,auVar127,auVar226);
            auVar129 = vfmadd213ps_fma(auVar129,auVar127,auVar229);
            auVar129 = vfmadd213ps_fma(auVar129,auVar127,auVar232);
            auVar129 = vfmadd213ps_fma(auVar129,auVar127,auVar115);
            auVar129 = vfmadd213ps_fma(auVar129,auVar195,auVar127);
            auVar188._0_4_ = auVar129._0_4_ + 1.0;
            auVar188._4_4_ = auVar129._4_4_ + 1.0;
            auVar188._8_4_ = auVar129._8_4_ + 1.0;
            auVar188._12_4_ = auVar129._12_4_ + 1.0;
            auVar196._0_4_ = (int)auVar132._0_4_;
            auVar196._4_4_ = (int)auVar132._4_4_;
            auVar196._8_4_ = (int)auVar132._8_4_;
            auVar196._12_4_ = (int)auVar132._12_4_;
            auVar129 = vpslld_avx(auVar196,0x17);
            auVar129 = vpaddd_avx(auVar236,auVar129);
            auVar129 = vfmadd213ps_fma(auVar129,auVar188,auVar112);
            uVar88 = vcmpps_avx512vl(auVar129,auVar185,2);
            auVar125._8_4_ = 0x800000;
            auVar125._0_8_ = 0x80000000800000;
            auVar125._12_4_ = 0x800000;
            auVar129 = vmaxps_avx512vl(auVar129,auVar125);
            auVar126 = vpsrld_avx(auVar129,0x17);
            auVar214._8_4_ = 0x807fffff;
            auVar214._0_8_ = 0x807fffff807fffff;
            auVar214._12_4_ = 0x807fffff;
            auVar130._8_4_ = 0x3f000000;
            auVar130._0_8_ = 0x3f0000003f000000;
            auVar130._12_4_ = 0x3f000000;
            auVar129 = vpternlogd_avx512vl(auVar129,auVar214,auVar130,0xea);
            auVar30._8_4_ = 0x3f3504f3;
            auVar30._0_8_ = 0x3f3504f33f3504f3;
            auVar30._12_4_ = 0x3f3504f3;
            uVar15 = vcmpps_avx512vl(auVar129,auVar30,1);
            auVar31._8_4_ = 0xbf800000;
            auVar31._0_8_ = 0xbf800000bf800000;
            auVar31._12_4_ = 0xbf800000;
            auVar127 = vaddps_avx512vl(auVar129,auVar31);
            auVar129 = vaddps_avx512vl(auVar127,auVar129);
            bVar13 = (bool)((byte)uVar15 & 1);
            auVar133._0_4_ = (float)((uint)bVar13 * auVar129._0_4_ | (uint)!bVar13 * auVar127._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
            auVar133._4_4_ = (float)((uint)bVar13 * auVar129._4_4_ | (uint)!bVar13 * auVar127._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
            auVar133._8_4_ = (float)((uint)bVar13 * auVar129._8_4_ | (uint)!bVar13 * auVar127._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
            auVar133._12_4_ =
                 (float)((uint)bVar13 * auVar129._12_4_ | (uint)!bVar13 * auVar127._12_4_);
            auVar189._0_4_ = auVar133._0_4_ * auVar133._0_4_;
            auVar189._4_4_ = auVar133._4_4_ * auVar133._4_4_;
            auVar189._8_4_ = auVar133._8_4_ * auVar133._8_4_;
            auVar189._12_4_ = auVar133._12_4_ * auVar133._12_4_;
            auVar32._8_4_ = 0xbdebd1b8;
            auVar32._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar32._12_4_ = 0xbdebd1b8;
            auVar129 = vfmadd213ps_avx512vl(auVar104,auVar133,auVar32);
            auVar33._8_4_ = 0x3def251a;
            auVar33._0_8_ = 0x3def251a3def251a;
            auVar33._12_4_ = 0x3def251a;
            auVar129 = vfmadd213ps_avx512vl(auVar129,auVar133,auVar33);
            auVar129 = vfmadd213ps_avx512vl(auVar129,auVar133,auVar105);
            auVar129 = vfmadd213ps_avx512vl(auVar129,auVar133,auVar106);
            auVar129 = vfmadd213ps_avx512vl(auVar129,auVar133,auVar107);
            auVar129 = vfmadd213ps_avx512vl(auVar129,auVar133,auVar108);
            auVar129 = vfmadd213ps_avx512vl(auVar129,auVar133,auVar109);
            auVar129 = vfmadd213ps_avx512vl(auVar129,auVar133,auVar110);
            auVar127 = vmulps_avx512vl(auVar189,auVar133);
            auVar172 = ZEXT1664(auVar127);
            auVar127 = vmulps_avx512vl(auVar127,auVar129);
            auVar34._8_4_ = 0xffffff82;
            auVar34._0_8_ = 0xffffff82ffffff82;
            auVar34._12_4_ = 0xffffff82;
            auVar129 = vpaddd_avx512vl(auVar126,auVar34);
            auVar129 = vcvtdq2ps_avx(auVar129);
            auVar126 = vsubps_avx512vl(auVar129,auVar112);
            bVar13 = (bool)((byte)uVar15 & 1);
            auVar134._0_4_ = (uint)bVar13 * auVar126._0_4_ | (uint)!bVar13 * auVar129._0_4_;
            bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
            auVar134._4_4_ = (uint)bVar13 * auVar126._4_4_ | (uint)!bVar13 * auVar129._4_4_;
            bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
            auVar134._8_4_ = (uint)bVar13 * auVar126._8_4_ | (uint)!bVar13 * auVar129._8_4_;
            bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
            auVar134._12_4_ = (uint)bVar13 * auVar126._12_4_ | (uint)!bVar13 * auVar129._12_4_;
            auVar129 = vfmadd231ps_fma(auVar127,auVar134,auVar240);
            auVar129 = vfmsub231ps_fma(auVar129,auVar115,auVar189);
            auVar129 = vsubps_avx(auVar129,auVar133);
            auVar129 = vfnmadd231ps_fma(auVar129,auVar113,auVar134);
            auVar127 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            bVar13 = (bool)((byte)uVar88 & 1);
            auVar135._0_4_ =
                 (uint)bVar13 * auVar127._0_4_ |
                 (uint)!bVar13 * (int)(auVar129._0_4_ + auVar129._0_4_);
            bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
            auVar135._4_4_ =
                 (uint)bVar13 * auVar127._4_4_ |
                 (uint)!bVar13 * (int)(auVar129._4_4_ + auVar129._4_4_);
            bVar13 = (bool)((byte)(uVar88 >> 2) & 1);
            auVar135._8_4_ =
                 (uint)bVar13 * auVar127._8_4_ |
                 (uint)!bVar13 * (int)(auVar129._8_4_ + auVar129._8_4_);
            bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar135._12_4_ =
                 (uint)bVar13 * auVar127._12_4_ |
                 (uint)!bVar13 * (int)(auVar129._12_4_ + auVar129._12_4_);
            auVar129 = vminps_avx512vl(auVar135,auVar103);
            auVar126 = vmaxps_avx512vl(auVar129,auVar123);
            auVar127 = vfmadd213ps_fma(auVar111,auVar126,auVar115);
            auVar215._0_4_ = (int)auVar127._0_4_;
            auVar215._4_4_ = (int)auVar127._4_4_;
            auVar215._8_4_ = (int)auVar127._8_4_;
            auVar215._12_4_ = (int)auVar127._12_4_;
            auVar129 = vcvtdq2ps_avx(auVar215);
            uVar88 = vcmpps_avx512vl(auVar127,auVar129,1);
            auVar127 = vsubps_avx512vl(auVar129,auVar112);
            bVar13 = (bool)((byte)uVar88 & 1);
            auVar136._0_4_ = (float)((uint)bVar13 * auVar127._0_4_ | (uint)!bVar13 * auVar129._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
            auVar136._4_4_ = (float)((uint)bVar13 * auVar127._4_4_ | (uint)!bVar13 * auVar129._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar88 >> 2) & 1);
            auVar136._8_4_ = (float)((uint)bVar13 * auVar127._8_4_ | (uint)!bVar13 * auVar129._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar136._12_4_ =
                 (float)((uint)bVar13 * auVar127._12_4_ | (uint)!bVar13 * auVar129._12_4_);
            auVar129 = vfmsub231ps_fma(auVar126,auVar136,auVar113);
            auVar127 = vfnmsub231ps_fma(auVar129,auVar136,auVar240);
            auVar197._0_4_ = auVar127._0_4_ * auVar127._0_4_;
            auVar197._4_4_ = auVar127._4_4_ * auVar127._4_4_;
            auVar197._8_4_ = auVar127._8_4_ * auVar127._8_4_;
            auVar197._12_4_ = auVar127._12_4_ * auVar127._12_4_;
            auVar129 = vfmadd213ps_fma(auVar114,auVar127,auVar223);
            auVar129 = vfmadd213ps_fma(auVar129,auVar127,auVar226);
            auVar129 = vfmadd213ps_fma(auVar129,auVar127,auVar229);
            auVar129 = vfmadd213ps_fma(auVar129,auVar127,auVar232);
            auVar129 = vfmadd213ps_fma(auVar129,auVar127,auVar115);
            auVar129 = vfmadd213ps_fma(auVar129,auVar197,auVar127);
            auVar190._0_4_ = auVar129._0_4_ + 1.0;
            auVar190._4_4_ = auVar129._4_4_ + 1.0;
            auVar190._8_4_ = auVar129._8_4_ + 1.0;
            auVar190._12_4_ = auVar129._12_4_ + 1.0;
            auVar198._0_4_ = (int)auVar136._0_4_;
            auVar198._4_4_ = (int)auVar136._4_4_;
            auVar198._8_4_ = (int)auVar136._8_4_;
            auVar198._12_4_ = (int)auVar136._12_4_;
            auVar129 = vpslld_avx(auVar198,0x17);
            auVar129 = vpaddd_avx(auVar236,auVar129);
            auVar129 = vfmadd213ps_fma(auVar129,auVar190,auVar112);
            auVar129 = vdivps_avx512vl(auVar124,auVar129);
            auVar129 = vfmsub213ps_avx512vl(auVar129,auVar128,auVar128);
            break;
          case 6:
            puVar7 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar2 = *puVar7;
            auVar127._4_4_ = uVar2;
            auVar127._0_4_ = uVar2;
            auVar127._8_4_ = uVar2;
            auVar127._12_4_ = uVar2;
            uVar2 = puVar7[1];
            auVar129._4_4_ = uVar2;
            auVar129._0_4_ = uVar2;
            auVar129._8_4_ = uVar2;
            auVar129._12_4_ = uVar2;
            auVar129 = vfmadd213ps_avx512vl(auVar127,auVar128,auVar129);
            auVar129 = vmaxps_avx(auVar129,auVar185);
            auVar129 = vminps_avx(auVar129,auVar112);
            auVar129 = vmulps_avx512vl(auVar129,auVar128);
          }
        }
        *(undefined1 (*) [16])((long)top_blob->data + lVar1 * 4) = auVar129;
        lVar92 = lVar92 + lVar93;
        lVar97 = lVar97 + lVar93;
        local_118 = local_118 + lVar93;
        local_120 = local_120 + lVar93;
      }
      pfVar11 = (float *)(this->super_InnerProduct).activation_params.data;
      pvVar9 = (this->weight_data_tm).data;
      pvVar12 = top_blob->data;
      local_148 = 0;
      for (lVar92 = (long)(int)((int)uVar101 + uVar84 * 4); lVar92 < (int)uVar4; lVar92 = lVar92 + 1
          ) {
        if (pvVar6 == (void *)0x0) {
          auVar172 = ZEXT1664(ZEXT816(0) << 0x40);
        }
        else {
          auVar172 = ZEXT464(*(uint *)((long)pvVar6 + lVar92 * 4));
        }
        pauVar87 = (undefined1 (*) [32])((long)pvVar9 + lVar92 * local_c0 * 4);
        auVar103 = ZEXT816(0) << 0x40;
        pauVar90 = pauVar96;
        for (iVar94 = 0; iVar94 + 7 < iVar91; iVar94 = iVar94 + 8) {
          auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),*pauVar90,*pauVar87);
          pauVar90 = pauVar90 + 1;
          pauVar87 = pauVar87 + 1;
        }
        auVar123 = ZEXT816(0) << 0x40;
        for (; iVar94 + 3 < iVar91; iVar94 = iVar94 + 4) {
          auVar123 = vfmadd231ps_fma(auVar123,*(undefined1 (*) [16])*pauVar90,
                                     *(undefined1 (*) [16])*pauVar87);
          pauVar90 = (undefined1 (*) [32])(*pauVar90 + 0x10);
          pauVar87 = (undefined1 (*) [32])(*pauVar87 + 0x10);
        }
        lVar93 = 0;
        for (; iVar94 < iVar91; iVar94 = iVar94 + 1) {
          auVar104 = vfmadd231ss_fma(auVar172._0_16_,ZEXT416(*(uint *)(*pauVar87 + lVar93)),
                                     ZEXT416(*(uint *)(*pauVar90 + lVar93)));
          auVar172 = ZEXT1664(auVar104);
          lVar93 = lVar93 + 4;
        }
        auVar104._0_4_ = auVar103._0_4_ + auVar123._0_4_ + 0.0;
        auVar104._4_4_ = auVar103._4_4_ + auVar123._4_4_ + 0.0;
        auVar104._8_4_ = auVar103._8_4_ + auVar123._8_4_ + 0.0;
        auVar104._12_4_ = auVar103._12_4_ + auVar123._12_4_ + 0.0;
        auVar103 = vhaddps_avx(auVar104,auVar104);
        auVar103 = vhaddps_avx(auVar103,auVar103);
        fVar220 = auVar103._0_4_ + auVar172._0_4_;
        auVar103 = ZEXT416((uint)fVar220);
        fVar183 = fVar220;
        switch(iVar83) {
        case 1:
          auVar103 = vmaxss_avx(auVar103,ZEXT416(0));
          fVar183 = auVar103._0_4_;
          break;
        case 2:
          uVar16 = vcmpss_avx512f(auVar103,ZEXT416(0),0xe);
          bVar13 = (bool)((byte)uVar16 & 1);
          fVar183 = (float)((uint)bVar13 * 0x3f800000 + (uint)!bVar13 * (int)*pfVar11) * fVar220;
          break;
        case 3:
          auVar103 = vmaxss_avx(auVar103,ZEXT416((uint)*pfVar11));
          fVar183 = auVar103._0_4_;
          if (pfVar11[1] < auVar103._0_4_) {
            fVar183 = pfVar11[1];
          }
          break;
        case 4:
          auVar103 = vminss_avx(auVar103,SUB6416(ZEXT464(0x42b0c0a5),0));
          auVar105._8_4_ = 0x80000000;
          auVar105._0_8_ = 0x8000000080000000;
          auVar105._12_4_ = 0x80000000;
          auVar123 = vxorps_avx512vl(auVar103,auVar105);
          uVar16 = vcmpss_avx512f(auVar103,ZEXT416(0xc2b0c0a5),1);
          bVar13 = (bool)((byte)uVar16 & 1);
          fVar220 = expf((float)((uint)bVar13 * 0x42b0c0a5 + (uint)!bVar13 * auVar123._0_4_));
          fVar183 = 1.0 / (fVar220 + 1.0);
          break;
        case 5:
          fVar183 = expf(fVar220);
          fVar183 = logf(fVar183 + 1.0);
          fVar183 = tanhf(fVar183);
          fVar183 = fVar183 * fVar220;
          break;
        case 6:
          fVar3 = *pfVar11;
          auVar123._8_4_ = 0x80000000;
          auVar123._0_8_ = 0x8000000080000000;
          auVar123._12_4_ = 0x80000000;
          auVar123 = vxorps_avx512vl(ZEXT416((uint)pfVar11[1]),auVar123);
          fVar204 = auVar123._0_4_ / fVar3;
          fVar183 = 0.0;
          if ((fVar204 <= fVar220) && (fVar183 = fVar220, fVar220 <= fVar204 + 1.0 / fVar3)) {
            auVar103 = vfmadd213ss_fma(ZEXT416((uint)fVar3),auVar103,ZEXT416((uint)pfVar11[1]));
            fVar183 = auVar103._0_4_ * fVar220;
          }
        }
        *(float *)((long)pvVar12 + lVar92 * 4) = fVar183;
      }
    }
    else if (iVar94 == 4) {
      local_148 = 0;
      uVar85 = 0;
      if (0 < (int)uVar4) {
        uVar85 = uVar101;
      }
      auVar124._8_4_ = 0x42b0c0a5;
      auVar124._0_8_ = 0x42b0c0a542b0c0a5;
      auVar124._12_4_ = 0x42b0c0a5;
      auVar185._8_4_ = 0xc2b0c0a5;
      auVar185._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar185._12_4_ = 0xc2b0c0a5;
      auVar205._8_4_ = 0x3f000000;
      auVar205._0_8_ = 0x3f0000003f000000;
      auVar205._12_4_ = 0x3f000000;
      auVar206._8_4_ = 0x3fb8aa3b;
      auVar206._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar206._12_4_ = 0x3fb8aa3b;
      auVar208._8_4_ = 0x3f800000;
      auVar208._0_8_ = 0x3f8000003f800000;
      auVar208._12_4_ = 0x3f800000;
      auVar209._8_4_ = 0x3f318000;
      auVar209._0_8_ = 0x3f3180003f318000;
      auVar209._12_4_ = 0x3f318000;
      auVar221._8_4_ = 0x39506967;
      auVar221._0_8_ = 0x3950696739506967;
      auVar221._12_4_ = 0x39506967;
      auVar222._8_4_ = 0x3ab743ce;
      auVar222._0_8_ = 0x3ab743ce3ab743ce;
      auVar222._12_4_ = 0x3ab743ce;
      auVar225._8_4_ = 0x3c088908;
      auVar225._0_8_ = 0x3c0889083c088908;
      auVar225._12_4_ = 0x3c088908;
      auVar228._8_4_ = 0x3d2aa9c1;
      auVar228._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar228._12_4_ = 0x3d2aa9c1;
      auVar231._8_4_ = 0x3e2aaaaa;
      auVar231._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar231._12_4_ = 0x3e2aaaaa;
      auVar235._8_4_ = 0x3f800000;
      auVar235._0_8_ = 0x3f8000003f800000;
      auVar235._12_4_ = 0x3f800000;
      auVar239._8_4_ = 0xb95e8083;
      auVar239._0_8_ = 0xb95e8083b95e8083;
      auVar239._12_4_ = 0xb95e8083;
      auVar123 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
      auVar104 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
      auVar105 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
      auVar106 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar107 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar108 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar109 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar103 = vxorps_avx512vl(auVar103,auVar103);
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
      for (uVar101 = 0; uVar101 != uVar85; uVar101 = uVar101 + 1) {
        if (pvVar6 == (void *)0x0) {
          auVar115 = ZEXT816(0) << 0x40;
        }
        else {
          auVar115 = *(undefined1 (*) [16])((long)pvVar6 + uVar101 * 0x10);
        }
        pvVar9 = (this->weight_data_tm).data;
        sVar10 = (this->weight_data_tm).elemsize;
        lVar92 = (long)(this->weight_data_tm).w;
        pauVar87 = (undefined1 (*) [32])(uVar101 * lVar92 * sVar10 + (long)pvVar9);
        lVar93 = 0;
        auVar172 = ZEXT1664(ZEXT816(0) << 0x40);
        lVar97 = 0;
        auVar173 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar111 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
        in_ZMM16 = ZEXT1664(auVar111);
        auVar111 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
        in_ZMM17 = ZEXT1664(auVar111);
        iVar94 = 0;
        pauVar96 = local_108;
        while( true ) {
          if (iVar91 <= iVar94 + 7) break;
          auVar111 = vbroadcastss_avx512vl(ZEXT416(*(uint *)*pauVar96));
          auVar112 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar96 + 4)));
          auVar138 = vinsertf32x4_avx512vl(ZEXT1632(auVar111),auVar112,1);
          auVar111 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar96 + 8)));
          auVar112 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar96 + 0xc)));
          auVar113 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar96 + 0x10)));
          auVar114 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar96 + 0x14)));
          auVar139 = vinsertf32x4_avx512vl(ZEXT1632(auVar111),auVar112,1);
          auVar140 = vinsertf32x4_avx512vl(ZEXT1632(auVar113),auVar114,1);
          auVar111 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar96 + 0x18)));
          auVar112 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar96 + 0x1c)));
          auVar138 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar138,*pauVar87);
          in_ZMM17 = ZEXT3264(auVar138);
          auVar138 = vfmadd231ps_avx512vl(in_ZMM16._0_32_,auVar139,pauVar87[1]);
          in_ZMM16 = ZEXT3264(auVar138);
          auVar138 = vfmadd231ps_avx512vl(auVar173._0_32_,auVar140,pauVar87[2]);
          auVar173 = ZEXT3264(auVar138);
          auVar138 = vinsertf32x4_avx512vl(ZEXT1632(auVar111),auVar112,1);
          auVar138 = vfmadd231ps_avx512vl(auVar172._0_32_,auVar138,pauVar87[3]);
          auVar172 = ZEXT3264(auVar138);
          pauVar96 = pauVar96 + 1;
          pauVar87 = pauVar87 + 4;
          iVar94 = iVar94 + 8;
          lVar97 = lVar97 + 0x20;
          lVar93 = lVar93 + 8;
        }
        lVar92 = sVar10 * uVar101 * lVar92;
        while( true ) {
          if (iVar91 <= iVar94 + 3) break;
          auVar111 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*local_108 + lVar97 + 4)));
          auVar112 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*local_108 + lVar97)));
          auVar113 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*local_108 + lVar97 + 0xc)));
          auVar138 = vinsertf32x4_avx512vl(ZEXT1632(auVar112),auVar111,1);
          auVar111 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*local_108 + lVar97 + 8)));
          auVar139 = vinsertf32x4_avx512vl(ZEXT1632(auVar111),auVar113,1);
          auVar138 = vfmadd231ps_avx512vl
                               (in_ZMM17._0_32_,auVar138,
                                *(undefined1 (*) [32])((long)pvVar9 + lVar97 * 4 + lVar92));
          in_ZMM17 = ZEXT3264(auVar138);
          auVar138 = vfmadd231ps_avx512vl
                               (in_ZMM16._0_32_,auVar139,
                                *(undefined1 (*) [32])((long)pvVar9 + lVar97 * 4 + lVar92 + 0x20));
          in_ZMM16 = ZEXT3264(auVar138);
          pauVar87 = pauVar87 + 2;
          iVar94 = iVar94 + 4;
          lVar97 = lVar97 + 0x10;
          lVar93 = lVar93 + 4;
        }
        for (; (int)lVar93 < iVar91; lVar93 = lVar93 + 1) {
          auVar111 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*local_108 + lVar93 * 4)));
          auVar115 = vfmadd231ps_avx512vl(auVar115,auVar111,*(undefined1 (*) [16])*pauVar87);
          pauVar87 = (undefined1 (*) [32])(*pauVar87 + 0x10);
        }
        auVar138 = vaddps_avx512vl(in_ZMM16._0_32_,in_ZMM17._0_32_);
        fVar220 = auVar138._4_4_ + auVar173._4_4_ + auVar172._4_4_;
        auVar184._0_4_ =
             auVar138._16_4_ + auVar173._16_4_ + auVar172._16_4_ +
             auVar138._0_4_ + auVar173._0_4_ + auVar172._0_4_ + auVar115._0_4_;
        auVar184._4_4_ = fVar220 + fVar220 + auVar115._4_4_;
        auVar184._8_4_ =
             auVar138._24_4_ + auVar173._24_4_ + auVar172._24_4_ +
             auVar138._8_4_ + auVar173._8_4_ + auVar172._8_4_ + auVar115._8_4_;
        auVar184._12_4_ =
             auVar138._28_4_ + auVar173._28_4_ + auVar172._28_4_ +
             auVar138._12_4_ + auVar173._12_4_ + auVar172._12_4_ + auVar115._12_4_;
        auVar116 = auVar184;
        if (iVar83 - 1U < 6) {
          auVar116 = vmaxps_avx512vl(auVar184,auVar103);
          switch(iVar83) {
          case 2:
            auVar115 = vminps_avx512vl(auVar184,auVar103);
            uVar2 = *(this->super_InnerProduct).activation_params.data;
            auVar29._4_4_ = uVar2;
            auVar29._0_4_ = uVar2;
            auVar29._8_4_ = uVar2;
            auVar29._12_4_ = uVar2;
            auVar116 = vfmadd231ps_avx512vl(auVar116,auVar115,auVar29);
            break;
          case 3:
            puVar7 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar2 = *puVar7;
            auVar27._4_4_ = uVar2;
            auVar27._0_4_ = uVar2;
            auVar27._8_4_ = uVar2;
            auVar27._12_4_ = uVar2;
            auVar115 = vmaxps_avx512vl(auVar184,auVar27);
            uVar2 = puVar7[1];
            auVar28._4_4_ = uVar2;
            auVar28._0_4_ = uVar2;
            auVar28._8_4_ = uVar2;
            auVar28._12_4_ = uVar2;
            auVar116 = vminps_avx512vl(auVar115,auVar28);
            break;
          case 4:
            auVar25._8_4_ = 0x80000000;
            auVar25._0_8_ = 0x8000000080000000;
            auVar25._12_4_ = 0x80000000;
            auVar115 = vxorps_avx512vl(auVar184,auVar25);
            auVar115 = vminps_avx(auVar115,auVar124);
            auVar111 = vmaxps_avx(auVar115,auVar185);
            auVar112 = vfmadd231ps_fma(auVar205,auVar111,auVar206);
            auVar245._0_4_ = (int)auVar112._0_4_;
            auVar245._4_4_ = (int)auVar112._4_4_;
            auVar245._8_4_ = (int)auVar112._8_4_;
            auVar245._12_4_ = (int)auVar112._12_4_;
            auVar115 = vcvtdq2ps_avx(auVar245);
            uVar88 = vcmpps_avx512vl(auVar112,auVar115,1);
            auVar112 = vsubps_avx512vl(auVar115,auVar208);
            bVar13 = (bool)((byte)uVar88 & 1);
            auVar122._0_4_ = (float)((uint)bVar13 * auVar112._0_4_ | (uint)!bVar13 * auVar115._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
            auVar122._4_4_ = (float)((uint)bVar13 * auVar112._4_4_ | (uint)!bVar13 * auVar115._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar88 >> 2) & 1);
            auVar122._8_4_ = (float)((uint)bVar13 * auVar112._8_4_ | (uint)!bVar13 * auVar115._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar122._12_4_ =
                 (float)((uint)bVar13 * auVar112._12_4_ | (uint)!bVar13 * auVar115._12_4_);
            auVar115 = vfmsub231ps_fma(auVar111,auVar122,auVar209);
            auVar26._8_4_ = 0x395e8083;
            auVar26._0_8_ = 0x395e8083395e8083;
            auVar26._12_4_ = 0x395e8083;
            auVar115 = vfmsub231ps_avx512vl(auVar115,auVar122,auVar26);
            auVar210._0_4_ = auVar115._0_4_ * auVar115._0_4_;
            auVar210._4_4_ = auVar115._4_4_ * auVar115._4_4_;
            auVar210._8_4_ = auVar115._8_4_ * auVar115._8_4_;
            auVar210._12_4_ = auVar115._12_4_ * auVar115._12_4_;
            auVar111 = vfmadd213ps_avx512vl(auVar221,auVar115,auVar222);
            auVar111 = vfmadd213ps_avx512vl(auVar111,auVar115,auVar225);
            auVar111 = vfmadd213ps_avx512vl(auVar111,auVar115,auVar228);
            auVar111 = vfmadd213ps_avx512vl(auVar111,auVar115,auVar231);
            auVar111 = vfmadd213ps_avx512vl(auVar111,auVar115,auVar205);
            auVar115 = vfmadd213ps_avx512vl(auVar111,auVar210,auVar115);
            in_ZMM16 = ZEXT1664(auVar115);
            auVar111 = vaddps_avx512vl(auVar115,auVar208);
            auVar211._0_4_ = (int)auVar122._0_4_;
            auVar211._4_4_ = (int)auVar122._4_4_;
            auVar211._8_4_ = (int)auVar122._8_4_;
            auVar211._12_4_ = (int)auVar122._12_4_;
            auVar115 = vpslld_avx(auVar211,0x17);
            auVar115 = vpaddd_avx(auVar235,auVar115);
            auVar115 = vfmadd213ps_fma(auVar115,auVar111,auVar208);
            auVar116 = vdivps_avx(auVar208,auVar115);
            break;
          case 5:
            auVar115 = vminps_avx(auVar184,auVar124);
            auVar115 = vmaxps_avx(auVar115,auVar185);
            auVar111 = vfmadd213ps_fma(auVar206,auVar115,auVar205);
            auVar112 = vcvttps2dq_avx512vl(auVar111);
            auVar112 = vcvtdq2ps_avx512vl(auVar112);
            uVar88 = vcmpps_avx512vl(auVar111,auVar112,1);
            auVar111 = vsubps_avx512vl(auVar112,auVar208);
            bVar13 = (bool)((byte)uVar88 & 1);
            auVar117._0_4_ = (uint)bVar13 * auVar111._0_4_ | (uint)!bVar13 * auVar112._0_4_;
            bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
            auVar117._4_4_ = (uint)bVar13 * auVar111._4_4_ | (uint)!bVar13 * auVar112._4_4_;
            bVar13 = (bool)((byte)(uVar88 >> 2) & 1);
            auVar117._8_4_ = (uint)bVar13 * auVar111._8_4_ | (uint)!bVar13 * auVar112._8_4_;
            bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar117._12_4_ = (uint)bVar13 * auVar111._12_4_ | (uint)!bVar13 * auVar112._12_4_;
            auVar115 = vfmsub231ps_avx512vl(auVar115,auVar117,auVar209);
            auVar115 = vfnmsub231ps_avx512vl(auVar115,auVar117,auVar239);
            auVar243._0_4_ = auVar115._0_4_ * auVar115._0_4_;
            auVar243._4_4_ = auVar115._4_4_ * auVar115._4_4_;
            auVar243._8_4_ = auVar115._8_4_ * auVar115._8_4_;
            auVar243._12_4_ = auVar115._12_4_ * auVar115._12_4_;
            auVar111 = vfmadd213ps_avx512vl(auVar221,auVar115,auVar222);
            auVar111 = vfmadd213ps_avx512vl(auVar111,auVar115,auVar225);
            auVar111 = vfmadd213ps_avx512vl(auVar111,auVar115,auVar228);
            auVar111 = vfmadd213ps_avx512vl(auVar111,auVar115,auVar231);
            auVar111 = vfmadd213ps_avx512vl(auVar111,auVar115,auVar205);
            auVar115 = vfmadd213ps_avx512vl(auVar111,auVar243,auVar115);
            auVar111 = vaddps_avx512vl(auVar115,auVar208);
            auVar115 = vcvttps2dq_avx512vl(auVar117);
            auVar115 = vpslld_avx(auVar115,0x17);
            auVar115 = vpaddd_avx(auVar115,auVar235);
            auVar115 = vfmadd213ps_fma(auVar115,auVar111,auVar208);
            uVar88 = vcmpps_avx512vl(auVar115,auVar103,2);
            auVar18._8_4_ = 0x800000;
            auVar18._0_8_ = 0x80000000800000;
            auVar18._12_4_ = 0x800000;
            auVar115 = vmaxps_avx512vl(auVar115,auVar18);
            auVar113 = vpsrld_avx(auVar115,0x17);
            auVar111 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
            auVar19._8_4_ = 0x3f000000;
            auVar19._0_8_ = 0x3f0000003f000000;
            auVar19._12_4_ = 0x3f000000;
            auVar115 = vpternlogd_avx512vl(auVar115,auVar111,auVar19,0xea);
            auVar20._8_4_ = 0x3f3504f3;
            auVar20._0_8_ = 0x3f3504f33f3504f3;
            auVar20._12_4_ = 0x3f3504f3;
            uVar15 = vcmpps_avx512vl(auVar115,auVar20,1);
            auVar21._8_4_ = 0xbf800000;
            auVar21._0_8_ = 0xbf800000bf800000;
            auVar21._12_4_ = 0xbf800000;
            auVar111 = vaddps_avx512vl(auVar115,auVar21);
            auVar115 = vaddps_avx512vl(auVar111,auVar115);
            bVar13 = (bool)((byte)uVar15 & 1);
            auVar118._0_4_ = (uint)bVar13 * auVar115._0_4_ | (uint)!bVar13 * auVar111._0_4_;
            bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
            auVar118._4_4_ = (uint)bVar13 * auVar115._4_4_ | (uint)!bVar13 * auVar111._4_4_;
            bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
            auVar118._8_4_ = (uint)bVar13 * auVar115._8_4_ | (uint)!bVar13 * auVar111._8_4_;
            bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
            auVar118._12_4_ = (uint)bVar13 * auVar115._12_4_ | (uint)!bVar13 * auVar111._12_4_;
            auVar111 = vmulps_avx512vl(auVar118,auVar118);
            auVar22._8_4_ = 0xbdebd1b8;
            auVar22._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar22._12_4_ = 0xbdebd1b8;
            auVar115 = vfmadd213ps_avx512vl(auVar123,auVar118,auVar22);
            auVar23._8_4_ = 0x3def251a;
            auVar23._0_8_ = 0x3def251a3def251a;
            auVar23._12_4_ = 0x3def251a;
            auVar115 = vfmadd213ps_avx512vl(auVar115,auVar118,auVar23);
            auVar115 = vfmadd213ps_avx512vl(auVar115,auVar118,auVar104);
            auVar115 = vfmadd213ps_avx512vl(auVar115,auVar118,auVar105);
            auVar115 = vfmadd213ps_avx512vl(auVar115,auVar118,auVar106);
            auVar115 = vfmadd213ps_avx512vl(auVar115,auVar118,auVar107);
            auVar115 = vfmadd213ps_avx512vl(auVar115,auVar118,auVar108);
            auVar115 = vfmadd213ps_avx512vl(auVar115,auVar118,auVar109);
            auVar112 = vmulps_avx512vl(auVar111,auVar118);
            auVar112 = vmulps_avx512vl(auVar112,auVar115);
            auVar24._8_4_ = 0xffffff82;
            auVar24._0_8_ = 0xffffff82ffffff82;
            auVar24._12_4_ = 0xffffff82;
            auVar115 = vpaddd_avx512vl(auVar113,auVar24);
            auVar115 = vcvtdq2ps_avx(auVar115);
            auVar113 = vsubps_avx512vl(auVar115,auVar208);
            bVar13 = (bool)((byte)uVar15 & 1);
            auVar119._0_4_ = (uint)bVar13 * auVar113._0_4_ | (uint)!bVar13 * auVar115._0_4_;
            bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
            auVar119._4_4_ = (uint)bVar13 * auVar113._4_4_ | (uint)!bVar13 * auVar115._4_4_;
            bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
            auVar119._8_4_ = (uint)bVar13 * auVar113._8_4_ | (uint)!bVar13 * auVar115._8_4_;
            bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
            auVar119._12_4_ = (uint)bVar13 * auVar113._12_4_ | (uint)!bVar13 * auVar115._12_4_;
            auVar115 = vfmadd231ps_avx512vl(auVar112,auVar119,auVar239);
            auVar115 = vfmsub231ps_avx512vl(auVar115,auVar205,auVar111);
            auVar115 = vsubps_avx512vl(auVar115,auVar118);
            auVar115 = vfnmadd231ps_fma(auVar115,auVar209,auVar119);
            auVar111 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            bVar13 = (bool)((byte)uVar88 & 1);
            auVar120._0_4_ =
                 (uint)bVar13 * auVar111._0_4_ |
                 (uint)!bVar13 * (int)(auVar115._0_4_ + auVar115._0_4_);
            bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
            auVar120._4_4_ =
                 (uint)bVar13 * auVar111._4_4_ |
                 (uint)!bVar13 * (int)(auVar115._4_4_ + auVar115._4_4_);
            bVar13 = (bool)((byte)(uVar88 >> 2) & 1);
            auVar120._8_4_ =
                 (uint)bVar13 * auVar111._8_4_ |
                 (uint)!bVar13 * (int)(auVar115._8_4_ + auVar115._8_4_);
            bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar120._12_4_ =
                 (uint)bVar13 * auVar111._12_4_ |
                 (uint)!bVar13 * (int)(auVar115._12_4_ + auVar115._12_4_);
            auVar115 = vminps_avx(auVar120,auVar124);
            auVar115 = vmaxps_avx(auVar115,auVar185);
            auVar111 = vfmadd213ps_fma(auVar206,auVar115,auVar205);
            auVar112 = vcvttps2dq_avx512vl(auVar111);
            auVar112 = vcvtdq2ps_avx512vl(auVar112);
            uVar88 = vcmpps_avx512vl(auVar111,auVar112,1);
            auVar111 = vsubps_avx512vl(auVar112,auVar208);
            bVar13 = (bool)((byte)uVar88 & 1);
            auVar121._0_4_ = (uint)bVar13 * auVar111._0_4_ | (uint)!bVar13 * auVar112._0_4_;
            bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
            auVar121._4_4_ = (uint)bVar13 * auVar111._4_4_ | (uint)!bVar13 * auVar112._4_4_;
            bVar13 = (bool)((byte)(uVar88 >> 2) & 1);
            auVar121._8_4_ = (uint)bVar13 * auVar111._8_4_ | (uint)!bVar13 * auVar112._8_4_;
            bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar121._12_4_ = (uint)bVar13 * auVar111._12_4_ | (uint)!bVar13 * auVar112._12_4_;
            in_ZMM16 = ZEXT1664(auVar121);
            auVar115 = vfmsub231ps_avx512vl(auVar115,auVar121,auVar209);
            auVar115 = vfnmsub231ps_avx512vl(auVar115,auVar121,auVar239);
            auVar244._0_4_ = auVar115._0_4_ * auVar115._0_4_;
            auVar244._4_4_ = auVar115._4_4_ * auVar115._4_4_;
            auVar244._8_4_ = auVar115._8_4_ * auVar115._8_4_;
            auVar244._12_4_ = auVar115._12_4_ * auVar115._12_4_;
            auVar111 = vfmadd213ps_avx512vl(auVar221,auVar115,auVar222);
            auVar111 = vfmadd213ps_avx512vl(auVar111,auVar115,auVar225);
            auVar111 = vfmadd213ps_avx512vl(auVar111,auVar115,auVar228);
            auVar111 = vfmadd213ps_avx512vl(auVar111,auVar115,auVar231);
            auVar111 = vfmadd213ps_avx512vl(auVar111,auVar115,auVar205);
            auVar115 = vfmadd213ps_avx512vl(auVar111,auVar244,auVar115);
            in_ZMM17 = ZEXT1664(auVar115);
            auVar111 = vaddps_avx512vl(auVar115,auVar208);
            auVar115 = vcvttps2dq_avx512vl(auVar121);
            auVar115 = vpslld_avx(auVar115,0x17);
            auVar115 = vpaddd_avx(auVar115,auVar235);
            auVar115 = vfmadd213ps_fma(auVar115,auVar111,auVar208);
            auVar115 = vdivps_avx512vl(auVar110,auVar115);
            auVar116 = vfmsub213ps_fma(auVar115,auVar184,auVar184);
            break;
          case 6:
            puVar7 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar2 = *puVar7;
            auVar212._4_4_ = uVar2;
            auVar212._0_4_ = uVar2;
            auVar212._8_4_ = uVar2;
            auVar212._12_4_ = uVar2;
            uVar2 = puVar7[1];
            auVar17._4_4_ = uVar2;
            auVar17._0_4_ = uVar2;
            auVar17._8_4_ = uVar2;
            auVar17._12_4_ = uVar2;
            auVar115 = vfmadd213ps_avx512vl(auVar212,auVar184,auVar17);
            auVar115 = vmaxps_avx512vl(auVar115,auVar103);
            auVar115 = vminps_avx(auVar115,auVar208);
            auVar116._0_4_ = auVar115._0_4_ * auVar184._0_4_;
            auVar116._4_4_ = auVar115._4_4_ * auVar184._4_4_;
            auVar116._8_4_ = auVar115._8_4_ * auVar184._8_4_;
            auVar116._12_4_ = auVar115._12_4_ * auVar184._12_4_;
          }
        }
        *(undefined1 (*) [16])((long)top_blob->data + uVar101 * 0x10) = auVar116;
      }
    }
    else if (iVar94 == 8) {
      local_148 = 0;
      if ((int)uVar4 < 1) {
        uVar101 = 0;
      }
      auVar155._8_4_ = 0x42b0c0a5;
      auVar155._0_8_ = 0x42b0c0a542b0c0a5;
      auVar155._12_4_ = 0x42b0c0a5;
      auVar155._16_4_ = 0x42b0c0a5;
      auVar155._20_4_ = 0x42b0c0a5;
      auVar155._24_4_ = 0x42b0c0a5;
      auVar155._28_4_ = 0x42b0c0a5;
      auVar156._8_4_ = 0xc2b0c0a5;
      auVar156._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar156._12_4_ = 0xc2b0c0a5;
      auVar156._16_4_ = 0xc2b0c0a5;
      auVar156._20_4_ = 0xc2b0c0a5;
      auVar156._24_4_ = 0xc2b0c0a5;
      auVar156._28_4_ = 0xc2b0c0a5;
      auVar157._8_4_ = 0x3f000000;
      auVar157._0_8_ = 0x3f0000003f000000;
      auVar157._12_4_ = 0x3f000000;
      auVar157._16_4_ = 0x3f000000;
      auVar157._20_4_ = 0x3f000000;
      auVar157._24_4_ = 0x3f000000;
      auVar157._28_4_ = 0x3f000000;
      auVar158._8_4_ = 0x3fb8aa3b;
      auVar158._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar158._12_4_ = 0x3fb8aa3b;
      auVar158._16_4_ = 0x3fb8aa3b;
      auVar158._20_4_ = 0x3fb8aa3b;
      auVar158._24_4_ = 0x3fb8aa3b;
      auVar158._28_4_ = 0x3fb8aa3b;
      auVar159._8_4_ = 0x3f800000;
      auVar159._0_8_ = 0x3f8000003f800000;
      auVar159._12_4_ = 0x3f800000;
      auVar159._16_4_ = 0x3f800000;
      auVar159._20_4_ = 0x3f800000;
      auVar159._24_4_ = 0x3f800000;
      auVar159._28_4_ = 0x3f800000;
      auVar160._8_4_ = 0x3f318000;
      auVar160._0_8_ = 0x3f3180003f318000;
      auVar160._12_4_ = 0x3f318000;
      auVar160._16_4_ = 0x3f318000;
      auVar160._20_4_ = 0x3f318000;
      auVar160._24_4_ = 0x3f318000;
      auVar160._28_4_ = 0x3f318000;
      auVar161._8_4_ = 0x39506967;
      auVar161._0_8_ = 0x3950696739506967;
      auVar161._12_4_ = 0x39506967;
      auVar161._16_4_ = 0x39506967;
      auVar161._20_4_ = 0x39506967;
      auVar161._24_4_ = 0x39506967;
      auVar161._28_4_ = 0x39506967;
      auVar224._8_4_ = 0x3ab743ce;
      auVar224._0_8_ = 0x3ab743ce3ab743ce;
      auVar224._12_4_ = 0x3ab743ce;
      auVar224._16_4_ = 0x3ab743ce;
      auVar224._20_4_ = 0x3ab743ce;
      auVar224._24_4_ = 0x3ab743ce;
      auVar224._28_4_ = 0x3ab743ce;
      auVar227._8_4_ = 0x3c088908;
      auVar227._0_8_ = 0x3c0889083c088908;
      auVar227._12_4_ = 0x3c088908;
      auVar227._16_4_ = 0x3c088908;
      auVar227._20_4_ = 0x3c088908;
      auVar227._24_4_ = 0x3c088908;
      auVar227._28_4_ = 0x3c088908;
      auVar230._8_4_ = 0x3d2aa9c1;
      auVar230._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar230._12_4_ = 0x3d2aa9c1;
      auVar230._16_4_ = 0x3d2aa9c1;
      auVar230._20_4_ = 0x3d2aa9c1;
      auVar230._24_4_ = 0x3d2aa9c1;
      auVar230._28_4_ = 0x3d2aa9c1;
      auVar233._8_4_ = 0x3e2aaaaa;
      auVar233._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar233._12_4_ = 0x3e2aaaaa;
      auVar233._16_4_ = 0x3e2aaaaa;
      auVar233._20_4_ = 0x3e2aaaaa;
      auVar233._24_4_ = 0x3e2aaaaa;
      auVar233._28_4_ = 0x3e2aaaaa;
      auVar237._8_4_ = 0x3f800000;
      auVar237._0_8_ = 0x3f8000003f800000;
      auVar237._12_4_ = 0x3f800000;
      auVar237._16_4_ = 0x3f800000;
      auVar237._20_4_ = 0x3f800000;
      auVar237._24_4_ = 0x3f800000;
      auVar237._28_4_ = 0x3f800000;
      auVar241._8_4_ = 0xb95e8083;
      auVar241._0_8_ = 0xb95e8083b95e8083;
      auVar241._12_4_ = 0xb95e8083;
      auVar241._16_4_ = 0xb95e8083;
      auVar241._20_4_ = 0xb95e8083;
      auVar241._24_4_ = 0xb95e8083;
      auVar241._28_4_ = 0xb95e8083;
      auVar138 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
      auVar139 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar140 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar141 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar142 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar103 = vxorps_avx512vl(auVar103,auVar103);
      auVar143 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
      for (uVar85 = 0; uVar85 != uVar101; uVar85 = uVar85 + 1) {
        auVar173 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar172 = ZEXT1664(ZEXT816(0) << 0x40);
        if (pvVar6 != (void *)0x0) {
          auVar172 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar6 + uVar85 * 0x20));
        }
        pvVar9 = (this->weight_data_tm).data;
        sVar10 = (this->weight_data_tm).elemsize;
        lVar92 = (long)(this->weight_data_tm).w;
        pauVar87 = (undefined1 (*) [32])(uVar85 * lVar92 * sVar10 + (long)pvVar9);
        lVar93 = 0;
        lVar97 = 0;
        auVar174 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar123 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
        in_ZMM16 = ZEXT1664(auVar123);
        auVar123 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
        in_ZMM18 = ZEXT1664(auVar123);
        auVar123 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
        in_ZMM17 = ZEXT1664(auVar123);
        auVar123 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
        in_ZMM19 = ZEXT1664(auVar123);
        auVar123 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
        in_ZMM22 = ZEXT1664(auVar123);
        iVar94 = 0;
        pauVar96 = local_108;
        while( true ) {
          if (iVar91 <= iVar94 + 7) break;
          auVar144 = vbroadcastss_avx512vl(ZEXT416(*(uint *)*pauVar96));
          auVar145 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar96 + 4)));
          auVar146 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar96 + 8)));
          auVar147 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar96 + 0xc)));
          auVar144 = vfmadd231ps_avx512vl(auVar172._0_32_,auVar144,*pauVar87);
          auVar172 = ZEXT3264(auVar144);
          auVar144 = vfmadd231ps_avx512vl(in_ZMM22._0_32_,auVar145,pauVar87[1]);
          in_ZMM22 = ZEXT3264(auVar144);
          auVar144 = vfmadd231ps_avx512vl(in_ZMM19._0_32_,auVar146,pauVar87[2]);
          in_ZMM19 = ZEXT3264(auVar144);
          auVar144 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar147,pauVar87[3]);
          in_ZMM17 = ZEXT3264(auVar144);
          auVar144 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar96 + 0x10)));
          auVar145 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar96 + 0x14)));
          auVar146 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar96 + 0x18)));
          auVar147 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar96 + 0x1c)));
          auVar144 = vfmadd231ps_avx512vl(in_ZMM18._0_32_,auVar144,pauVar87[4]);
          in_ZMM18 = ZEXT3264(auVar144);
          auVar144 = vfmadd231ps_avx512vl(in_ZMM16._0_32_,auVar145,pauVar87[5]);
          in_ZMM16 = ZEXT3264(auVar144);
          auVar144 = vfmadd231ps_avx512vl(auVar174._0_32_,auVar146,pauVar87[6]);
          auVar174 = ZEXT3264(auVar144);
          auVar144 = vfmadd231ps_avx512vl(auVar173._0_32_,auVar147,pauVar87[7]);
          auVar173 = ZEXT3264(auVar144);
          pauVar96 = pauVar96 + 1;
          pauVar87 = pauVar87 + 8;
          iVar94 = iVar94 + 8;
          lVar97 = lVar97 + 0x20;
          lVar93 = lVar93 + 8;
        }
        lVar92 = sVar10 * uVar85 * lVar92;
        while( true ) {
          if (iVar91 <= iVar94 + 3) break;
          auVar144 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*local_108 + lVar97)));
          auVar145 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*local_108 + lVar97 + 4)));
          auVar146 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*local_108 + lVar97 + 8)));
          auVar147 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*local_108 + lVar97 + 0xc)));
          auVar144 = vfmadd231ps_avx512vl
                               (auVar172._0_32_,auVar144,
                                *(undefined1 (*) [32])((long)pvVar9 + lVar97 * 8 + lVar92));
          auVar172 = ZEXT3264(auVar144);
          auVar144 = vfmadd231ps_avx512vl
                               (in_ZMM22._0_32_,auVar145,
                                *(undefined1 (*) [32])((long)pvVar9 + lVar97 * 8 + lVar92 + 0x20));
          in_ZMM22 = ZEXT3264(auVar144);
          auVar144 = vfmadd231ps_avx512vl
                               (in_ZMM19._0_32_,auVar146,
                                *(undefined1 (*) [32])((long)pvVar9 + lVar97 * 8 + lVar92 + 0x40));
          in_ZMM19 = ZEXT3264(auVar144);
          auVar144 = vfmadd231ps_avx512vl
                               (in_ZMM17._0_32_,auVar147,
                                *(undefined1 (*) [32])((long)pvVar9 + lVar97 * 8 + lVar92 + 0x60));
          in_ZMM17 = ZEXT3264(auVar144);
          pauVar87 = pauVar87 + 4;
          iVar94 = iVar94 + 4;
          lVar97 = lVar97 + 0x10;
          lVar93 = lVar93 + 4;
        }
        for (; (int)lVar93 < iVar91; lVar93 = lVar93 + 1) {
          auVar144 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*local_108 + lVar93 * 4)));
          auVar144 = vfmadd231ps_avx512vl(auVar172._0_32_,auVar144,*pauVar87);
          auVar172 = ZEXT3264(auVar144);
          pauVar87 = pauVar87 + 1;
        }
        auVar144 = vaddps_avx512vl(in_ZMM16._0_32_,in_ZMM18._0_32_);
        auVar145 = vaddps_avx512vl(in_ZMM17._0_32_,in_ZMM19._0_32_);
        auVar145 = vaddps_avx512vl(auVar145,in_ZMM22._0_32_);
        auVar186._0_4_ =
             auVar145._0_4_ + auVar144._0_4_ + auVar174._0_4_ + auVar173._0_4_ + auVar172._0_4_;
        auVar186._4_4_ =
             auVar145._4_4_ + auVar144._4_4_ + auVar174._4_4_ + auVar173._4_4_ + auVar172._4_4_;
        auVar186._8_4_ =
             auVar145._8_4_ + auVar144._8_4_ + auVar174._8_4_ + auVar173._8_4_ + auVar172._8_4_;
        auVar186._12_4_ =
             auVar145._12_4_ + auVar144._12_4_ + auVar174._12_4_ + auVar173._12_4_ + auVar172._12_4_
        ;
        auVar186._16_4_ =
             auVar145._16_4_ + auVar144._16_4_ + auVar174._16_4_ + auVar173._16_4_ + auVar172._16_4_
        ;
        auVar186._20_4_ =
             auVar145._20_4_ + auVar144._20_4_ + auVar174._20_4_ + auVar173._20_4_ + auVar172._20_4_
        ;
        auVar186._24_4_ =
             auVar145._24_4_ + auVar144._24_4_ + auVar174._24_4_ + auVar173._24_4_ + auVar172._24_4_
        ;
        auVar186._28_4_ =
             auVar145._28_4_ + auVar144._28_4_ + auVar174._28_4_ + auVar173._28_4_ + auVar172._28_4_
        ;
        auVar148 = auVar186;
        if (5 < iVar83 - 1U) goto switchD_002935b3_caseD_1;
        auVar148 = vmaxps_avx512vl(auVar186,ZEXT1632(auVar103));
        switch(iVar83) {
        case 2:
          auVar144 = vminps_avx512vl(auVar186,ZEXT1632(auVar103));
          uVar2 = *(this->super_InnerProduct).activation_params.data;
          auVar53._4_4_ = uVar2;
          auVar53._0_4_ = uVar2;
          auVar53._8_4_ = uVar2;
          auVar53._12_4_ = uVar2;
          auVar53._16_4_ = uVar2;
          auVar53._20_4_ = uVar2;
          auVar53._24_4_ = uVar2;
          auVar53._28_4_ = uVar2;
          auVar148 = vfmadd231ps_avx512vl(auVar148,auVar144,auVar53);
          break;
        case 3:
          puVar7 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar2 = *puVar7;
          auVar51._4_4_ = uVar2;
          auVar51._0_4_ = uVar2;
          auVar51._8_4_ = uVar2;
          auVar51._12_4_ = uVar2;
          auVar51._16_4_ = uVar2;
          auVar51._20_4_ = uVar2;
          auVar51._24_4_ = uVar2;
          auVar51._28_4_ = uVar2;
          auVar144 = vmaxps_avx512vl(auVar186,auVar51);
          uVar2 = puVar7[1];
          auVar52._4_4_ = uVar2;
          auVar52._0_4_ = uVar2;
          auVar52._8_4_ = uVar2;
          auVar52._12_4_ = uVar2;
          auVar52._16_4_ = uVar2;
          auVar52._20_4_ = uVar2;
          auVar52._24_4_ = uVar2;
          auVar52._28_4_ = uVar2;
          auVar148 = vminps_avx512vl(auVar144,auVar52);
          break;
        case 4:
          auVar49._8_4_ = 0x80000000;
          auVar49._0_8_ = 0x8000000080000000;
          auVar49._12_4_ = 0x80000000;
          auVar49._16_4_ = 0x80000000;
          auVar49._20_4_ = 0x80000000;
          auVar49._24_4_ = 0x80000000;
          auVar49._28_4_ = 0x80000000;
          auVar144 = vxorps_avx512vl(auVar186,auVar49);
          auVar144 = vminps_avx(auVar144,auVar155);
          auVar144 = vmaxps_avx(auVar144,auVar156);
          auVar123 = vfmadd231ps_fma(auVar157,auVar144,auVar158);
          auVar145 = vroundps_avx(ZEXT1632(auVar123),1);
          uVar88 = vcmpps_avx512vl(ZEXT1632(auVar123),auVar145,1);
          auVar146 = vsubps_avx512vl(auVar145,auVar159);
          bVar13 = (bool)((byte)uVar88 & 1);
          auVar154._0_4_ = (float)((uint)bVar13 * auVar146._0_4_ | (uint)!bVar13 * auVar145._0_4_);
          bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
          auVar154._4_4_ = (float)((uint)bVar13 * auVar146._4_4_ | (uint)!bVar13 * auVar145._4_4_);
          bVar13 = (bool)((byte)(uVar88 >> 2) & 1);
          auVar154._8_4_ = (float)((uint)bVar13 * auVar146._8_4_ | (uint)!bVar13 * auVar145._8_4_);
          bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
          auVar154._12_4_ =
               (float)((uint)bVar13 * auVar146._12_4_ | (uint)!bVar13 * auVar145._12_4_);
          bVar13 = (bool)((byte)(uVar88 >> 4) & 1);
          auVar154._16_4_ =
               (float)((uint)bVar13 * auVar146._16_4_ | (uint)!bVar13 * auVar145._16_4_);
          bVar13 = (bool)((byte)(uVar88 >> 5) & 1);
          auVar154._20_4_ =
               (float)((uint)bVar13 * auVar146._20_4_ | (uint)!bVar13 * auVar145._20_4_);
          bVar13 = (bool)((byte)(uVar88 >> 6) & 1);
          auVar154._24_4_ =
               (float)((uint)bVar13 * auVar146._24_4_ | (uint)!bVar13 * auVar145._24_4_);
          bVar13 = SUB81(uVar88 >> 7,0);
          auVar154._28_4_ =
               (float)((uint)bVar13 * auVar146._28_4_ | (uint)!bVar13 * auVar145._28_4_);
          auVar123 = vfmsub231ps_fma(auVar144,auVar154,auVar160);
          auVar50._8_4_ = 0x395e8083;
          auVar50._0_8_ = 0x395e8083395e8083;
          auVar50._12_4_ = 0x395e8083;
          auVar50._16_4_ = 0x395e8083;
          auVar50._20_4_ = 0x395e8083;
          auVar50._24_4_ = 0x395e8083;
          auVar50._28_4_ = 0x395e8083;
          auVar144 = vfmsub231ps_avx512vl(ZEXT1632(auVar123),auVar154,auVar50);
          auVar217._0_4_ = auVar144._0_4_ * auVar144._0_4_;
          auVar217._4_4_ = auVar144._4_4_ * auVar144._4_4_;
          auVar217._8_4_ = auVar144._8_4_ * auVar144._8_4_;
          auVar217._12_4_ = auVar144._12_4_ * auVar144._12_4_;
          auVar217._16_4_ = auVar144._16_4_ * auVar144._16_4_;
          auVar217._20_4_ = auVar144._20_4_ * auVar144._20_4_;
          auVar217._24_4_ = auVar144._24_4_ * auVar144._24_4_;
          auVar217._28_4_ = 0;
          auVar145 = vfmadd213ps_avx512vl(auVar161,auVar144,auVar224);
          auVar145 = vfmadd213ps_avx512vl(auVar145,auVar144,auVar227);
          auVar145 = vfmadd213ps_avx512vl(auVar145,auVar144,auVar230);
          auVar145 = vfmadd213ps_avx512vl(auVar145,auVar144,auVar233);
          auVar145 = vfmadd213ps_avx512vl(auVar145,auVar144,auVar157);
          auVar144 = vfmadd213ps_avx512vl(auVar145,auVar217,auVar144);
          in_ZMM16 = ZEXT3264(auVar144);
          auVar145 = vaddps_avx512vl(auVar144,auVar159);
          auVar218._0_4_ = (int)auVar154._0_4_;
          auVar218._4_4_ = (int)auVar154._4_4_;
          auVar218._8_4_ = (int)auVar154._8_4_;
          auVar218._12_4_ = (int)auVar154._12_4_;
          auVar218._16_4_ = (int)auVar154._16_4_;
          auVar218._20_4_ = (int)auVar154._20_4_;
          auVar218._24_4_ = (int)auVar154._24_4_;
          auVar218._28_4_ = (int)auVar154._28_4_;
          auVar144 = vpslld_avx2(auVar218,0x17);
          auVar144 = vpaddd_avx2(auVar237,auVar144);
          auVar123 = vfmadd213ps_fma(auVar144,auVar145,auVar159);
          auVar148 = vdivps_avx(auVar159,ZEXT1632(auVar123));
          break;
        case 5:
          auVar144 = vminps_avx(auVar186,auVar155);
          auVar144 = vmaxps_avx(auVar144,auVar156);
          auVar123 = vfmadd213ps_fma(auVar158,auVar144,auVar157);
          auVar145 = vrndscaleps_avx512vl(ZEXT1632(auVar123),1);
          uVar88 = vcmpps_avx512vl(ZEXT1632(auVar123),auVar145,1);
          auVar146 = vsubps_avx512vl(auVar145,auVar159);
          bVar13 = (bool)((byte)uVar88 & 1);
          auVar149._0_4_ = (uint)bVar13 * auVar146._0_4_ | (uint)!bVar13 * auVar145._0_4_;
          bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
          auVar149._4_4_ = (uint)bVar13 * auVar146._4_4_ | (uint)!bVar13 * auVar145._4_4_;
          bVar13 = (bool)((byte)(uVar88 >> 2) & 1);
          auVar149._8_4_ = (uint)bVar13 * auVar146._8_4_ | (uint)!bVar13 * auVar145._8_4_;
          bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
          auVar149._12_4_ = (uint)bVar13 * auVar146._12_4_ | (uint)!bVar13 * auVar145._12_4_;
          bVar13 = (bool)((byte)(uVar88 >> 4) & 1);
          auVar149._16_4_ = (uint)bVar13 * auVar146._16_4_ | (uint)!bVar13 * auVar145._16_4_;
          bVar13 = (bool)((byte)(uVar88 >> 5) & 1);
          auVar149._20_4_ = (uint)bVar13 * auVar146._20_4_ | (uint)!bVar13 * auVar145._20_4_;
          bVar13 = (bool)((byte)(uVar88 >> 6) & 1);
          auVar149._24_4_ = (uint)bVar13 * auVar146._24_4_ | (uint)!bVar13 * auVar145._24_4_;
          bVar13 = SUB81(uVar88 >> 7,0);
          auVar149._28_4_ = (uint)bVar13 * auVar146._28_4_ | (uint)!bVar13 * auVar145._28_4_;
          auVar144 = vfmsub231ps_avx512vl(auVar144,auVar149,auVar160);
          auVar144 = vfnmsub231ps_avx512vl(auVar144,auVar149,auVar241);
          auVar246._0_4_ = auVar144._0_4_ * auVar144._0_4_;
          auVar246._4_4_ = auVar144._4_4_ * auVar144._4_4_;
          auVar246._8_4_ = auVar144._8_4_ * auVar144._8_4_;
          auVar246._12_4_ = auVar144._12_4_ * auVar144._12_4_;
          auVar246._16_4_ = auVar144._16_4_ * auVar144._16_4_;
          auVar246._20_4_ = auVar144._20_4_ * auVar144._20_4_;
          auVar246._24_4_ = auVar144._24_4_ * auVar144._24_4_;
          auVar246._28_4_ = 0;
          auVar145 = vfmadd213ps_avx512vl(auVar161,auVar144,auVar224);
          auVar145 = vfmadd213ps_avx512vl(auVar145,auVar144,auVar227);
          auVar145 = vfmadd213ps_avx512vl(auVar145,auVar144,auVar230);
          auVar145 = vfmadd213ps_avx512vl(auVar145,auVar144,auVar233);
          auVar145 = vfmadd213ps_avx512vl(auVar145,auVar144,auVar157);
          auVar144 = vfmadd213ps_avx512vl(auVar145,auVar246,auVar144);
          auVar145 = vaddps_avx512vl(auVar144,auVar159);
          auVar144 = vcvttps2dq_avx512vl(auVar149);
          auVar144 = vpslld_avx2(auVar144,0x17);
          auVar144 = vpaddd_avx2(auVar144,auVar237);
          auVar123 = vfmadd213ps_fma(auVar144,auVar145,auVar159);
          uVar88 = vcmpps_avx512vl(ZEXT1632(auVar123),ZEXT1632(auVar103),2);
          auVar41._8_4_ = 0x800000;
          auVar41._0_8_ = 0x80000000800000;
          auVar41._12_4_ = 0x800000;
          auVar41._16_4_ = 0x800000;
          auVar41._20_4_ = 0x800000;
          auVar41._24_4_ = 0x800000;
          auVar41._28_4_ = 0x800000;
          auVar144 = vmaxps_avx512vl(ZEXT1632(auVar123),auVar41);
          auVar147 = vpsrld_avx2(auVar144,0x17);
          auVar145 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
          auVar42._8_4_ = 0x3f000000;
          auVar42._0_8_ = 0x3f0000003f000000;
          auVar42._12_4_ = 0x3f000000;
          auVar42._16_4_ = 0x3f000000;
          auVar42._20_4_ = 0x3f000000;
          auVar42._24_4_ = 0x3f000000;
          auVar42._28_4_ = 0x3f000000;
          auVar144 = vpternlogd_avx512vl(auVar144,auVar145,auVar42,0xea);
          auVar43._8_4_ = 0x3f3504f3;
          auVar43._0_8_ = 0x3f3504f33f3504f3;
          auVar43._12_4_ = 0x3f3504f3;
          auVar43._16_4_ = 0x3f3504f3;
          auVar43._20_4_ = 0x3f3504f3;
          auVar43._24_4_ = 0x3f3504f3;
          auVar43._28_4_ = 0x3f3504f3;
          uVar15 = vcmpps_avx512vl(auVar144,auVar43,1);
          auVar145 = vaddps_avx512vl(auVar144,auVar138);
          auVar144 = vaddps_avx512vl(auVar145,auVar144);
          bVar13 = (bool)((byte)uVar15 & 1);
          auVar150._0_4_ = (uint)bVar13 * auVar144._0_4_ | (uint)!bVar13 * auVar145._0_4_;
          bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
          auVar150._4_4_ = (uint)bVar13 * auVar144._4_4_ | (uint)!bVar13 * auVar145._4_4_;
          bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
          auVar150._8_4_ = (uint)bVar13 * auVar144._8_4_ | (uint)!bVar13 * auVar145._8_4_;
          bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
          auVar150._12_4_ = (uint)bVar13 * auVar144._12_4_ | (uint)!bVar13 * auVar145._12_4_;
          bVar13 = (bool)((byte)(uVar15 >> 4) & 1);
          auVar150._16_4_ = (uint)bVar13 * auVar144._16_4_ | (uint)!bVar13 * auVar145._16_4_;
          bVar13 = (bool)((byte)(uVar15 >> 5) & 1);
          auVar150._20_4_ = (uint)bVar13 * auVar144._20_4_ | (uint)!bVar13 * auVar145._20_4_;
          bVar13 = (bool)((byte)(uVar15 >> 6) & 1);
          auVar150._24_4_ = (uint)bVar13 * auVar144._24_4_ | (uint)!bVar13 * auVar145._24_4_;
          bVar13 = SUB81(uVar15 >> 7,0);
          auVar150._28_4_ = (uint)bVar13 * auVar144._28_4_ | (uint)!bVar13 * auVar145._28_4_;
          auVar145 = vmulps_avx512vl(auVar150,auVar150);
          auVar144 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
          auVar44._8_4_ = 0xbdebd1b8;
          auVar44._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar44._12_4_ = 0xbdebd1b8;
          auVar44._16_4_ = 0xbdebd1b8;
          auVar44._20_4_ = 0xbdebd1b8;
          auVar44._24_4_ = 0xbdebd1b8;
          auVar44._28_4_ = 0xbdebd1b8;
          auVar144 = vfmadd213ps_avx512vl(auVar144,auVar150,auVar44);
          auVar45._8_4_ = 0x3def251a;
          auVar45._0_8_ = 0x3def251a3def251a;
          auVar45._12_4_ = 0x3def251a;
          auVar45._16_4_ = 0x3def251a;
          auVar45._20_4_ = 0x3def251a;
          auVar45._24_4_ = 0x3def251a;
          auVar45._28_4_ = 0x3def251a;
          auVar144 = vfmadd213ps_avx512vl(auVar144,auVar150,auVar45);
          auVar46._8_4_ = 0xbdfe5d4f;
          auVar46._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar46._12_4_ = 0xbdfe5d4f;
          auVar46._16_4_ = 0xbdfe5d4f;
          auVar46._20_4_ = 0xbdfe5d4f;
          auVar46._24_4_ = 0xbdfe5d4f;
          auVar46._28_4_ = 0xbdfe5d4f;
          auVar144 = vfmadd213ps_avx512vl(auVar144,auVar150,auVar46);
          auVar47._8_4_ = 0x3e11e9bf;
          auVar47._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar47._12_4_ = 0x3e11e9bf;
          auVar47._16_4_ = 0x3e11e9bf;
          auVar47._20_4_ = 0x3e11e9bf;
          auVar47._24_4_ = 0x3e11e9bf;
          auVar47._28_4_ = 0x3e11e9bf;
          auVar144 = vfmadd213ps_avx512vl(auVar144,auVar150,auVar47);
          auVar144 = vfmadd213ps_avx512vl(auVar144,auVar150,auVar139);
          auVar144 = vfmadd213ps_avx512vl(auVar144,auVar150,auVar140);
          auVar144 = vfmadd213ps_avx512vl(auVar144,auVar150,auVar141);
          auVar144 = vfmadd213ps_avx512vl(auVar144,auVar150,auVar142);
          auVar146 = vmulps_avx512vl(auVar145,auVar150);
          in_ZMM18 = ZEXT3264(auVar146);
          auVar146 = vmulps_avx512vl(auVar146,auVar144);
          auVar48._8_4_ = 0xffffff82;
          auVar48._0_8_ = 0xffffff82ffffff82;
          auVar48._12_4_ = 0xffffff82;
          auVar48._16_4_ = 0xffffff82;
          auVar48._20_4_ = 0xffffff82;
          auVar48._24_4_ = 0xffffff82;
          auVar48._28_4_ = 0xffffff82;
          auVar144 = vpaddd_avx512vl(auVar147,auVar48);
          auVar144 = vcvtdq2ps_avx(auVar144);
          auVar147 = vsubps_avx512vl(auVar144,auVar159);
          bVar13 = (bool)((byte)uVar15 & 1);
          auVar151._0_4_ = (uint)bVar13 * auVar147._0_4_ | (uint)!bVar13 * auVar144._0_4_;
          bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
          auVar151._4_4_ = (uint)bVar13 * auVar147._4_4_ | (uint)!bVar13 * auVar144._4_4_;
          bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
          auVar151._8_4_ = (uint)bVar13 * auVar147._8_4_ | (uint)!bVar13 * auVar144._8_4_;
          bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
          auVar151._12_4_ = (uint)bVar13 * auVar147._12_4_ | (uint)!bVar13 * auVar144._12_4_;
          bVar13 = (bool)((byte)(uVar15 >> 4) & 1);
          auVar151._16_4_ = (uint)bVar13 * auVar147._16_4_ | (uint)!bVar13 * auVar144._16_4_;
          bVar13 = (bool)((byte)(uVar15 >> 5) & 1);
          auVar151._20_4_ = (uint)bVar13 * auVar147._20_4_ | (uint)!bVar13 * auVar144._20_4_;
          bVar13 = (bool)((byte)(uVar15 >> 6) & 1);
          auVar151._24_4_ = (uint)bVar13 * auVar147._24_4_ | (uint)!bVar13 * auVar144._24_4_;
          bVar13 = SUB81(uVar15 >> 7,0);
          auVar151._28_4_ = (uint)bVar13 * auVar147._28_4_ | (uint)!bVar13 * auVar144._28_4_;
          auVar144 = vfmadd231ps_avx512vl(auVar146,auVar151,auVar241);
          auVar144 = vfmsub231ps_avx512vl(auVar144,auVar157,auVar145);
          auVar144 = vsubps_avx512vl(auVar144,auVar150);
          auVar123 = vfmsub231ps_fma(auVar144,auVar160,auVar151);
          auVar144 = vmulps_avx512vl(ZEXT1632(auVar123),auVar143);
          auVar145 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          bVar13 = (bool)((byte)uVar88 & 1);
          auVar152._0_4_ = (uint)bVar13 * auVar145._0_4_ | (uint)!bVar13 * auVar144._0_4_;
          bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
          auVar152._4_4_ = (uint)bVar13 * auVar145._4_4_ | (uint)!bVar13 * auVar144._4_4_;
          bVar13 = (bool)((byte)(uVar88 >> 2) & 1);
          auVar152._8_4_ = (uint)bVar13 * auVar145._8_4_ | (uint)!bVar13 * auVar144._8_4_;
          bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
          auVar152._12_4_ = (uint)bVar13 * auVar145._12_4_ | (uint)!bVar13 * auVar144._12_4_;
          bVar13 = (bool)((byte)(uVar88 >> 4) & 1);
          auVar152._16_4_ = (uint)bVar13 * auVar145._16_4_ | (uint)!bVar13 * auVar144._16_4_;
          bVar13 = (bool)((byte)(uVar88 >> 5) & 1);
          auVar152._20_4_ = (uint)bVar13 * auVar145._20_4_ | (uint)!bVar13 * auVar144._20_4_;
          bVar13 = (bool)((byte)(uVar88 >> 6) & 1);
          auVar152._24_4_ = (uint)bVar13 * auVar145._24_4_ | (uint)!bVar13 * auVar144._24_4_;
          bVar13 = SUB81(uVar88 >> 7,0);
          auVar152._28_4_ = (uint)bVar13 * auVar145._28_4_ | (uint)!bVar13 * auVar144._28_4_;
          auVar144 = vminps_avx(auVar152,auVar155);
          auVar144 = vmaxps_avx(auVar144,auVar156);
          auVar123 = vfmadd213ps_fma(auVar158,auVar144,auVar157);
          auVar145 = vrndscaleps_avx512vl(ZEXT1632(auVar123),1);
          uVar88 = vcmpps_avx512vl(ZEXT1632(auVar123),auVar145,1);
          auVar146 = vsubps_avx512vl(auVar145,auVar159);
          bVar13 = (bool)((byte)uVar88 & 1);
          auVar153._0_4_ = (uint)bVar13 * auVar146._0_4_ | (uint)!bVar13 * auVar145._0_4_;
          bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
          auVar153._4_4_ = (uint)bVar13 * auVar146._4_4_ | (uint)!bVar13 * auVar145._4_4_;
          bVar13 = (bool)((byte)(uVar88 >> 2) & 1);
          auVar153._8_4_ = (uint)bVar13 * auVar146._8_4_ | (uint)!bVar13 * auVar145._8_4_;
          bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
          auVar153._12_4_ = (uint)bVar13 * auVar146._12_4_ | (uint)!bVar13 * auVar145._12_4_;
          bVar13 = (bool)((byte)(uVar88 >> 4) & 1);
          auVar153._16_4_ = (uint)bVar13 * auVar146._16_4_ | (uint)!bVar13 * auVar145._16_4_;
          bVar13 = (bool)((byte)(uVar88 >> 5) & 1);
          auVar153._20_4_ = (uint)bVar13 * auVar146._20_4_ | (uint)!bVar13 * auVar145._20_4_;
          bVar13 = (bool)((byte)(uVar88 >> 6) & 1);
          auVar153._24_4_ = (uint)bVar13 * auVar146._24_4_ | (uint)!bVar13 * auVar145._24_4_;
          bVar13 = SUB81(uVar88 >> 7,0);
          auVar153._28_4_ = (uint)bVar13 * auVar146._28_4_ | (uint)!bVar13 * auVar145._28_4_;
          in_ZMM16 = ZEXT3264(auVar153);
          auVar144 = vfmsub231ps_avx512vl(auVar144,auVar153,auVar160);
          auVar144 = vfnmsub231ps_avx512vl(auVar144,auVar153,auVar241);
          auVar247._0_4_ = auVar144._0_4_ * auVar144._0_4_;
          auVar247._4_4_ = auVar144._4_4_ * auVar144._4_4_;
          auVar247._8_4_ = auVar144._8_4_ * auVar144._8_4_;
          auVar247._12_4_ = auVar144._12_4_ * auVar144._12_4_;
          auVar247._16_4_ = auVar144._16_4_ * auVar144._16_4_;
          auVar247._20_4_ = auVar144._20_4_ * auVar144._20_4_;
          auVar247._24_4_ = auVar144._24_4_ * auVar144._24_4_;
          auVar247._28_4_ = 0;
          auVar145 = vfmadd213ps_avx512vl(auVar161,auVar144,auVar224);
          auVar145 = vfmadd213ps_avx512vl(auVar145,auVar144,auVar227);
          auVar145 = vfmadd213ps_avx512vl(auVar145,auVar144,auVar230);
          auVar145 = vfmadd213ps_avx512vl(auVar145,auVar144,auVar233);
          auVar145 = vfmadd213ps_avx512vl(auVar145,auVar144,auVar157);
          auVar144 = vfmadd213ps_avx512vl(auVar145,auVar247,auVar144);
          in_ZMM17 = ZEXT3264(auVar144);
          auVar145 = vaddps_avx512vl(auVar144,auVar159);
          auVar144 = vcvttps2dq_avx512vl(auVar153);
          auVar144 = vpslld_avx2(auVar144,0x17);
          auVar144 = vpaddd_avx2(auVar144,auVar237);
          auVar123 = vfmadd213ps_fma(auVar144,auVar145,auVar159);
          auVar144 = vdivps_avx(auVar159,ZEXT1632(auVar123));
          auVar144 = vfnmadd213ps_avx512vl(auVar144,auVar143,auVar138);
          goto LAB_0029386d;
        case 6:
          puVar7 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar2 = *puVar7;
          auVar219._4_4_ = uVar2;
          auVar219._0_4_ = uVar2;
          auVar219._8_4_ = uVar2;
          auVar219._12_4_ = uVar2;
          auVar219._16_4_ = uVar2;
          auVar219._20_4_ = uVar2;
          auVar219._24_4_ = uVar2;
          auVar219._28_4_ = uVar2;
          uVar2 = puVar7[1];
          auVar40._4_4_ = uVar2;
          auVar40._0_4_ = uVar2;
          auVar40._8_4_ = uVar2;
          auVar40._12_4_ = uVar2;
          auVar40._16_4_ = uVar2;
          auVar40._20_4_ = uVar2;
          auVar40._24_4_ = uVar2;
          auVar40._28_4_ = uVar2;
          auVar144 = vfmadd213ps_avx512vl(auVar219,auVar186,auVar40);
          auVar144 = vmaxps_avx512vl(auVar144,ZEXT1632(auVar103));
          auVar144 = vminps_avx(auVar144,auVar159);
LAB_0029386d:
          auVar148._4_4_ = auVar144._4_4_ * auVar186._4_4_;
          auVar148._0_4_ = auVar144._0_4_ * auVar186._0_4_;
          auVar148._8_4_ = auVar144._8_4_ * auVar186._8_4_;
          auVar148._12_4_ = auVar144._12_4_ * auVar186._12_4_;
          auVar148._16_4_ = auVar144._16_4_ * auVar186._16_4_;
          auVar148._20_4_ = auVar144._20_4_ * auVar186._20_4_;
          auVar148._24_4_ = auVar144._24_4_ * auVar186._24_4_;
          auVar148._28_4_ = auVar144._28_4_;
        }
switchD_002935b3_caseD_1:
        *(undefined1 (*) [32])((long)top_blob->data + uVar85 * 0x20) = auVar148;
      }
    }
    else {
      local_148 = 0;
      if (iVar94 == 0x10) {
        auVar172 = vbroadcastss_avx512f(ZEXT416(0x80000000));
        auVar173 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q2,auVar172);
        auVar174 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q1,auVar172);
        auVar175 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
        local_148 = 0;
        uVar101 = (ulong)uVar4;
        if ((int)uVar4 < 1) {
          uVar101 = 0;
        }
        auVar176 = vxorps_avx512dq((undefined1  [64])::_ps512_cephes_exp_p5,auVar172);
        auVar177 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar103 = vxorps_avx512vl(auVar103,auVar103);
        auVar251 = ZEXT1664(auVar103);
        auVar178 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
        for (uVar85 = 0; uVar85 != uVar101; uVar85 = uVar85 + 1) {
          auVar103 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
          auVar249 = ZEXT1664(auVar103);
          auVar103 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
          auVar248 = ZEXT1664(auVar103);
          if (pvVar6 != (void *)0x0) {
            auVar248 = *(undefined1 (*) [64])((long)pvVar6 + uVar85 * 0x40);
          }
          pauVar86 = (undefined1 (*) [64])
                     ((long)(this->weight_data_tm).w * uVar85 * (this->weight_data_tm).elemsize +
                     (long)(this->weight_data_tm).data);
          lVar92 = 0;
          iVar94 = 0;
          auVar103 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
          auVar250 = ZEXT1664(auVar103);
          auVar103 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
          in_ZMM19 = ZEXT1664(auVar103);
          auVar103 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
          in_ZMM21 = ZEXT1664(auVar103);
          auVar103 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
          in_ZMM20 = ZEXT1664(auVar103);
          auVar103 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
          in_ZMM22 = ZEXT1664(auVar103);
          auVar103 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
          in_ZMM23 = ZEXT1664(auVar103);
          pauVar96 = local_108;
          for (; iVar94 + 7 < iVar91; iVar94 = iVar94 + 8) {
            auVar179 = vbroadcastss_avx512f(ZEXT416(*(uint *)*pauVar96));
            auVar180 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar96 + 4)));
            auVar181 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar96 + 8)));
            auVar182 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar96 + 0xc)));
            auVar248 = vfmadd231ps_avx512f(auVar248,auVar179,*pauVar86);
            in_ZMM23 = vfmadd231ps_avx512f(in_ZMM23,auVar180,pauVar86[1]);
            in_ZMM22 = vfmadd231ps_avx512f(in_ZMM22,auVar181,pauVar86[2]);
            in_ZMM20 = vfmadd231ps_avx512f(in_ZMM20,auVar182,pauVar86[3]);
            auVar179 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar96 + 0x10)));
            auVar180 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar96 + 0x14)));
            auVar181 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar96 + 0x18)));
            auVar182 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar96 + 0x1c)));
            in_ZMM21 = vfmadd231ps_avx512f(in_ZMM21,auVar179,pauVar86[4]);
            in_ZMM19 = vfmadd231ps_avx512f(in_ZMM19,auVar180,pauVar86[5]);
            auVar250 = vfmadd231ps_avx512f(auVar250,auVar181,pauVar86[6]);
            auVar249 = vfmadd231ps_avx512f(auVar249,auVar182,pauVar86[7]);
            pauVar96 = pauVar96 + 1;
            pauVar86 = pauVar86 + 8;
            lVar92 = lVar92 + 8;
          }
          for (; iVar94 + 3 < iVar91; iVar94 = iVar94 + 4) {
            auVar179 = vbroadcastss_avx512f(ZEXT416(*(uint *)*pauVar96));
            auVar180 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar96 + 4)));
            auVar181 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar96 + 8)));
            auVar182 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar96 + 0xc)));
            auVar248 = vfmadd231ps_avx512f(auVar248,auVar179,*pauVar86);
            in_ZMM23 = vfmadd231ps_avx512f(in_ZMM23,auVar180,pauVar86[1]);
            in_ZMM22 = vfmadd231ps_avx512f(in_ZMM22,auVar181,pauVar86[2]);
            in_ZMM20 = vfmadd231ps_avx512f(in_ZMM20,auVar182,pauVar86[3]);
            pauVar96 = (undefined1 (*) [32])(*pauVar96 + 0x10);
            pauVar86 = pauVar86 + 4;
            lVar92 = lVar92 + 4;
          }
          for (; (int)lVar92 < iVar91; lVar92 = lVar92 + 1) {
            auVar179 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*local_108 + lVar92 * 4)));
            auVar248 = vfmadd231ps_avx512f(auVar248,auVar179,*pauVar86);
            pauVar86 = pauVar86 + 1;
          }
          auVar249 = vaddps_avx512f(auVar250,auVar249);
          auVar250 = vaddps_avx512f(in_ZMM19,in_ZMM21);
          auVar249 = vaddps_avx512f(auVar249,auVar250);
          auVar250 = vaddps_avx512f(in_ZMM20,in_ZMM22);
          in_ZMM18 = vaddps_avx512f(auVar250,in_ZMM23);
          in_ZMM17 = vaddps_avx512f(auVar249,in_ZMM18);
          auVar248 = vaddps_avx512f(in_ZMM17,auVar248);
          in_ZMM16 = auVar248;
          switch(iVar83) {
          case 1:
            in_ZMM16 = vmaxps_avx512f(auVar248,auVar251);
            break;
          case 2:
            uVar88 = vcmpps_avx512f(auVar248,auVar251,1);
            uVar2 = *(this->super_InnerProduct).activation_params.data;
            auVar67._4_4_ = uVar2;
            auVar67._0_4_ = uVar2;
            auVar67._8_4_ = uVar2;
            auVar67._12_4_ = uVar2;
            auVar67._16_4_ = uVar2;
            auVar67._20_4_ = uVar2;
            auVar67._24_4_ = uVar2;
            auVar67._28_4_ = uVar2;
            auVar67._32_4_ = uVar2;
            auVar67._36_4_ = uVar2;
            auVar67._40_4_ = uVar2;
            auVar67._44_4_ = uVar2;
            auVar67._48_4_ = uVar2;
            auVar67._52_4_ = uVar2;
            auVar67._56_4_ = uVar2;
            auVar67._60_4_ = uVar2;
            auVar249 = vmulps_avx512f(auVar248,auVar67);
            bVar13 = (bool)((byte)uVar88 & 1);
            in_ZMM16._0_4_ = (uint)bVar13 * auVar249._0_4_ | (uint)!bVar13 * auVar248._0_4_;
            bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
            in_ZMM16._4_4_ = (uint)bVar13 * auVar249._4_4_ | (uint)!bVar13 * auVar248._4_4_;
            bVar13 = (bool)((byte)(uVar88 >> 2) & 1);
            in_ZMM16._8_4_ = (uint)bVar13 * auVar249._8_4_ | (uint)!bVar13 * auVar248._8_4_;
            bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
            in_ZMM16._12_4_ = (uint)bVar13 * auVar249._12_4_ | (uint)!bVar13 * auVar248._12_4_;
            bVar13 = (bool)((byte)(uVar88 >> 4) & 1);
            in_ZMM16._16_4_ = (uint)bVar13 * auVar249._16_4_ | (uint)!bVar13 * auVar248._16_4_;
            bVar13 = (bool)((byte)(uVar88 >> 5) & 1);
            in_ZMM16._20_4_ = (uint)bVar13 * auVar249._20_4_ | (uint)!bVar13 * auVar248._20_4_;
            bVar13 = (bool)((byte)(uVar88 >> 6) & 1);
            in_ZMM16._24_4_ = (uint)bVar13 * auVar249._24_4_ | (uint)!bVar13 * auVar248._24_4_;
            bVar13 = (bool)((byte)(uVar88 >> 7) & 1);
            in_ZMM16._28_4_ = (uint)bVar13 * auVar249._28_4_ | (uint)!bVar13 * auVar248._28_4_;
            bVar13 = (bool)((byte)(uVar88 >> 8) & 1);
            in_ZMM16._32_4_ = (uint)bVar13 * auVar249._32_4_ | (uint)!bVar13 * auVar248._32_4_;
            bVar13 = (bool)((byte)(uVar88 >> 9) & 1);
            in_ZMM16._36_4_ = (uint)bVar13 * auVar249._36_4_ | (uint)!bVar13 * auVar248._36_4_;
            bVar13 = (bool)((byte)(uVar88 >> 10) & 1);
            in_ZMM16._40_4_ = (uint)bVar13 * auVar249._40_4_ | (uint)!bVar13 * auVar248._40_4_;
            bVar13 = (bool)((byte)(uVar88 >> 0xb) & 1);
            in_ZMM16._44_4_ = (uint)bVar13 * auVar249._44_4_ | (uint)!bVar13 * auVar248._44_4_;
            bVar13 = (bool)((byte)(uVar88 >> 0xc) & 1);
            in_ZMM16._48_4_ = (uint)bVar13 * auVar249._48_4_ | (uint)!bVar13 * auVar248._48_4_;
            bVar13 = (bool)((byte)(uVar88 >> 0xd) & 1);
            in_ZMM16._52_4_ = (uint)bVar13 * auVar249._52_4_ | (uint)!bVar13 * auVar248._52_4_;
            bVar13 = (bool)((byte)(uVar88 >> 0xe) & 1);
            in_ZMM16._56_4_ = (uint)bVar13 * auVar249._56_4_ | (uint)!bVar13 * auVar248._56_4_;
            bVar13 = SUB81(uVar88 >> 0xf,0);
            in_ZMM16._60_4_ = (uint)bVar13 * auVar249._60_4_ | (uint)!bVar13 * auVar248._60_4_;
            break;
          case 3:
            puVar7 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar2 = *puVar7;
            auVar179._4_4_ = uVar2;
            auVar179._0_4_ = uVar2;
            auVar179._8_4_ = uVar2;
            auVar179._12_4_ = uVar2;
            auVar179._16_4_ = uVar2;
            auVar179._20_4_ = uVar2;
            auVar179._24_4_ = uVar2;
            auVar179._28_4_ = uVar2;
            auVar179._32_4_ = uVar2;
            auVar179._36_4_ = uVar2;
            auVar179._40_4_ = uVar2;
            auVar179._44_4_ = uVar2;
            auVar179._48_4_ = uVar2;
            auVar179._52_4_ = uVar2;
            auVar179._56_4_ = uVar2;
            auVar179._60_4_ = uVar2;
            auVar249 = vmaxps_avx512f(auVar248,auVar179);
            uVar2 = puVar7[1];
            auVar248._4_4_ = uVar2;
            auVar248._0_4_ = uVar2;
            auVar248._8_4_ = uVar2;
            auVar248._12_4_ = uVar2;
            auVar248._16_4_ = uVar2;
            auVar248._20_4_ = uVar2;
            auVar248._24_4_ = uVar2;
            auVar248._28_4_ = uVar2;
            auVar248._32_4_ = uVar2;
            auVar248._36_4_ = uVar2;
            auVar248._40_4_ = uVar2;
            auVar248._44_4_ = uVar2;
            auVar248._48_4_ = uVar2;
            auVar248._52_4_ = uVar2;
            auVar248._56_4_ = uVar2;
            auVar248._60_4_ = uVar2;
            in_ZMM16 = vminps_avx512f(auVar249,auVar248);
            break;
          case 4:
            auVar248 = vxorps_avx512dq(auVar248,auVar172);
            auVar248 = vminps_avx512f(auVar248,(undefined1  [64])afVar72);
            auVar248 = vmaxps_avx512f(auVar248,(undefined1  [64])afVar73);
            auVar249 = vfmadd213ps_avx512f((undefined1  [64])afVar74,auVar248,
                                           (undefined1  [64])afVar80);
            auVar250 = vrndscaleps_avx512f(auVar249,1);
            uVar88 = vcmpps_avx512f(auVar249,auVar250,1);
            auVar249 = vsubps_avx512f(auVar250,(undefined1  [64])afVar71);
            bVar13 = (bool)((byte)uVar88 & 1);
            in_ZMM18._0_4_ = (uint)bVar13 * auVar249._0_4_ | (uint)!bVar13 * auVar250._0_4_;
            bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
            in_ZMM18._4_4_ = (uint)bVar13 * auVar249._4_4_ | (uint)!bVar13 * auVar250._4_4_;
            bVar13 = (bool)((byte)(uVar88 >> 2) & 1);
            in_ZMM18._8_4_ = (uint)bVar13 * auVar249._8_4_ | (uint)!bVar13 * auVar250._8_4_;
            bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
            in_ZMM18._12_4_ = (uint)bVar13 * auVar249._12_4_ | (uint)!bVar13 * auVar250._12_4_;
            bVar13 = (bool)((byte)(uVar88 >> 4) & 1);
            in_ZMM18._16_4_ = (uint)bVar13 * auVar249._16_4_ | (uint)!bVar13 * auVar250._16_4_;
            bVar13 = (bool)((byte)(uVar88 >> 5) & 1);
            in_ZMM18._20_4_ = (uint)bVar13 * auVar249._20_4_ | (uint)!bVar13 * auVar250._20_4_;
            bVar13 = (bool)((byte)(uVar88 >> 6) & 1);
            in_ZMM18._24_4_ = (uint)bVar13 * auVar249._24_4_ | (uint)!bVar13 * auVar250._24_4_;
            bVar13 = (bool)((byte)(uVar88 >> 7) & 1);
            in_ZMM18._28_4_ = (uint)bVar13 * auVar249._28_4_ | (uint)!bVar13 * auVar250._28_4_;
            bVar13 = (bool)((byte)(uVar88 >> 8) & 1);
            in_ZMM18._32_4_ = (uint)bVar13 * auVar249._32_4_ | (uint)!bVar13 * auVar250._32_4_;
            bVar13 = (bool)((byte)(uVar88 >> 9) & 1);
            in_ZMM18._36_4_ = (uint)bVar13 * auVar249._36_4_ | (uint)!bVar13 * auVar250._36_4_;
            bVar13 = (bool)((byte)(uVar88 >> 10) & 1);
            in_ZMM18._40_4_ = (uint)bVar13 * auVar249._40_4_ | (uint)!bVar13 * auVar250._40_4_;
            bVar13 = (bool)((byte)(uVar88 >> 0xb) & 1);
            in_ZMM18._44_4_ = (uint)bVar13 * auVar249._44_4_ | (uint)!bVar13 * auVar250._44_4_;
            bVar13 = (bool)((byte)(uVar88 >> 0xc) & 1);
            in_ZMM18._48_4_ = (uint)bVar13 * auVar249._48_4_ | (uint)!bVar13 * auVar250._48_4_;
            bVar13 = (bool)((byte)(uVar88 >> 0xd) & 1);
            in_ZMM18._52_4_ = (uint)bVar13 * auVar249._52_4_ | (uint)!bVar13 * auVar250._52_4_;
            bVar13 = (bool)((byte)(uVar88 >> 0xe) & 1);
            in_ZMM18._56_4_ = (uint)bVar13 * auVar249._56_4_ | (uint)!bVar13 * auVar250._56_4_;
            bVar13 = SUB81(uVar88 >> 0xf,0);
            in_ZMM18._60_4_ = (uint)bVar13 * auVar249._60_4_ | (uint)!bVar13 * auVar250._60_4_;
            auVar248 = vfmadd231ps_avx512f(auVar248,in_ZMM18,auVar173);
            auVar248 = vfmadd231ps_avx512f(auVar248,in_ZMM18,auVar174);
            auVar249 = vmulps_avx512f(auVar248,auVar248);
            auVar250 = vfmadd213ps_avx512f(auVar248,(undefined1  [64])afVar75,
                                           (undefined1  [64])afVar76);
            auVar250 = vfmadd213ps_avx512f(auVar250,auVar248,(undefined1  [64])afVar77);
            auVar250 = vfmadd213ps_avx512f(auVar250,auVar248,(undefined1  [64])afVar78);
            auVar250 = vfmadd213ps_avx512f(auVar250,auVar248,(undefined1  [64])afVar79);
            auVar250 = vfmadd213ps_avx512f(auVar250,auVar248,(undefined1  [64])afVar80);
            in_ZMM19 = vfmadd213ps_avx512f(auVar250,auVar249,auVar248);
            auVar248 = vaddps_avx512f(in_ZMM19,(undefined1  [64])afVar71);
            auVar249 = vcvttps2dq_avx512f(in_ZMM18);
            auVar249 = vpaddd_avx512f(auVar249,auVar175);
            auVar249 = vpslld_avx512f(auVar249,0x17);
            in_ZMM17 = vfmadd213ps_avx512f(auVar249,auVar248,auVar177);
            in_ZMM16 = vdivps_avx512f(auVar177,in_ZMM17);
            break;
          case 5:
            auVar249 = vminps_avx512f(auVar248,(undefined1  [64])afVar72);
            auVar249 = vmaxps_avx512f(auVar249,(undefined1  [64])afVar73);
            auVar250 = vfmadd213ps_avx512f((undefined1  [64])afVar74,auVar249,
                                           (undefined1  [64])afVar80);
            auVar179 = vrndscaleps_avx512f(auVar250,1);
            uVar88 = vcmpps_avx512f(auVar250,auVar179,1);
            auVar250 = vsubps_avx512f(auVar179,(undefined1  [64])afVar71);
            bVar13 = (bool)((byte)uVar88 & 1);
            auVar180._0_4_ = (uint)bVar13 * auVar250._0_4_ | (uint)!bVar13 * auVar179._0_4_;
            bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
            auVar180._4_4_ = (uint)bVar13 * auVar250._4_4_ | (uint)!bVar13 * auVar179._4_4_;
            bVar13 = (bool)((byte)(uVar88 >> 2) & 1);
            auVar180._8_4_ = (uint)bVar13 * auVar250._8_4_ | (uint)!bVar13 * auVar179._8_4_;
            bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar180._12_4_ = (uint)bVar13 * auVar250._12_4_ | (uint)!bVar13 * auVar179._12_4_;
            bVar13 = (bool)((byte)(uVar88 >> 4) & 1);
            auVar180._16_4_ = (uint)bVar13 * auVar250._16_4_ | (uint)!bVar13 * auVar179._16_4_;
            bVar13 = (bool)((byte)(uVar88 >> 5) & 1);
            auVar180._20_4_ = (uint)bVar13 * auVar250._20_4_ | (uint)!bVar13 * auVar179._20_4_;
            bVar13 = (bool)((byte)(uVar88 >> 6) & 1);
            auVar180._24_4_ = (uint)bVar13 * auVar250._24_4_ | (uint)!bVar13 * auVar179._24_4_;
            bVar13 = (bool)((byte)(uVar88 >> 7) & 1);
            auVar180._28_4_ = (uint)bVar13 * auVar250._28_4_ | (uint)!bVar13 * auVar179._28_4_;
            bVar13 = (bool)((byte)(uVar88 >> 8) & 1);
            auVar180._32_4_ = (uint)bVar13 * auVar250._32_4_ | (uint)!bVar13 * auVar179._32_4_;
            bVar13 = (bool)((byte)(uVar88 >> 9) & 1);
            auVar180._36_4_ = (uint)bVar13 * auVar250._36_4_ | (uint)!bVar13 * auVar179._36_4_;
            bVar13 = (bool)((byte)(uVar88 >> 10) & 1);
            auVar180._40_4_ = (uint)bVar13 * auVar250._40_4_ | (uint)!bVar13 * auVar179._40_4_;
            bVar13 = (bool)((byte)(uVar88 >> 0xb) & 1);
            auVar180._44_4_ = (uint)bVar13 * auVar250._44_4_ | (uint)!bVar13 * auVar179._44_4_;
            bVar13 = (bool)((byte)(uVar88 >> 0xc) & 1);
            auVar180._48_4_ = (uint)bVar13 * auVar250._48_4_ | (uint)!bVar13 * auVar179._48_4_;
            bVar13 = (bool)((byte)(uVar88 >> 0xd) & 1);
            auVar180._52_4_ = (uint)bVar13 * auVar250._52_4_ | (uint)!bVar13 * auVar179._52_4_;
            bVar13 = (bool)((byte)(uVar88 >> 0xe) & 1);
            auVar180._56_4_ = (uint)bVar13 * auVar250._56_4_ | (uint)!bVar13 * auVar179._56_4_;
            bVar13 = SUB81(uVar88 >> 0xf,0);
            auVar180._60_4_ = (uint)bVar13 * auVar250._60_4_ | (uint)!bVar13 * auVar179._60_4_;
            auVar249 = vfmadd231ps_avx512f(auVar249,auVar180,auVar173);
            auVar249 = vfmadd231ps_avx512f(auVar249,auVar180,auVar174);
            auVar250 = vmulps_avx512f(auVar249,auVar249);
            auVar179 = vfmadd213ps_avx512f(auVar249,(undefined1  [64])afVar75,
                                           (undefined1  [64])afVar76);
            auVar179 = vfmadd213ps_avx512f(auVar179,auVar249,(undefined1  [64])afVar77);
            auVar179 = vfmadd213ps_avx512f(auVar179,auVar249,(undefined1  [64])afVar78);
            auVar179 = vfmadd213ps_avx512f(auVar179,auVar249,(undefined1  [64])afVar79);
            auVar179 = vfmadd213ps_avx512f(auVar179,auVar249,(undefined1  [64])afVar80);
            auVar249 = vfmadd213ps_avx512f(auVar179,auVar250,auVar249);
            auVar249 = vaddps_avx512f(auVar249,(undefined1  [64])afVar71);
            auVar250 = vcvttps2dq_avx512f(auVar180);
            auVar250 = vpaddd_avx512f(auVar250,auVar175);
            auVar250 = vpslld_avx512f(auVar250,0x17);
            auVar249 = vfmadd213ps_avx512f(auVar250,auVar249,auVar177);
            auVar250 = vmaxps_avx512f(auVar249,(undefined1  [64])_ps512_min_norm_pos);
            auVar179 = vpsrld_avx512f(auVar250,0x17);
            auVar250 = vpternlogd_avx512f(auVar250,(undefined1  [64])afVar80,
                                          (undefined1  [64])_ps512_inv_mant_mask,0xec);
            uVar88 = vcmpps_avx512f(auVar250,(undefined1  [64])_ps512_cephes_SQRTHF,1);
            auVar180 = vsubps_avx512f(auVar250,(undefined1  [64])afVar71);
            auVar250 = vaddps_avx512f(auVar180,auVar250);
            bVar13 = (bool)((byte)uVar88 & 1);
            auVar181._0_4_ = (uint)bVar13 * auVar250._0_4_ | (uint)!bVar13 * auVar180._0_4_;
            bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
            auVar181._4_4_ = (uint)bVar13 * auVar250._4_4_ | (uint)!bVar13 * auVar180._4_4_;
            bVar13 = (bool)((byte)(uVar88 >> 2) & 1);
            auVar181._8_4_ = (uint)bVar13 * auVar250._8_4_ | (uint)!bVar13 * auVar180._8_4_;
            bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar181._12_4_ = (uint)bVar13 * auVar250._12_4_ | (uint)!bVar13 * auVar180._12_4_;
            bVar13 = (bool)((byte)(uVar88 >> 4) & 1);
            auVar181._16_4_ = (uint)bVar13 * auVar250._16_4_ | (uint)!bVar13 * auVar180._16_4_;
            bVar13 = (bool)((byte)(uVar88 >> 5) & 1);
            auVar181._20_4_ = (uint)bVar13 * auVar250._20_4_ | (uint)!bVar13 * auVar180._20_4_;
            bVar13 = (bool)((byte)(uVar88 >> 6) & 1);
            auVar181._24_4_ = (uint)bVar13 * auVar250._24_4_ | (uint)!bVar13 * auVar180._24_4_;
            bVar13 = (bool)((byte)(uVar88 >> 7) & 1);
            auVar181._28_4_ = (uint)bVar13 * auVar250._28_4_ | (uint)!bVar13 * auVar180._28_4_;
            bVar14 = (byte)(uVar88 >> 8);
            bVar13 = (bool)(bVar14 & 1);
            auVar181._32_4_ = (uint)bVar13 * auVar250._32_4_ | (uint)!bVar13 * auVar180._32_4_;
            bVar13 = (bool)((byte)(uVar88 >> 9) & 1);
            auVar181._36_4_ = (uint)bVar13 * auVar250._36_4_ | (uint)!bVar13 * auVar180._36_4_;
            bVar13 = (bool)((byte)(uVar88 >> 10) & 1);
            auVar181._40_4_ = (uint)bVar13 * auVar250._40_4_ | (uint)!bVar13 * auVar180._40_4_;
            bVar13 = (bool)((byte)(uVar88 >> 0xb) & 1);
            auVar181._44_4_ = (uint)bVar13 * auVar250._44_4_ | (uint)!bVar13 * auVar180._44_4_;
            bVar13 = (bool)((byte)(uVar88 >> 0xc) & 1);
            auVar181._48_4_ = (uint)bVar13 * auVar250._48_4_ | (uint)!bVar13 * auVar180._48_4_;
            bVar13 = (bool)((byte)(uVar88 >> 0xd) & 1);
            auVar181._52_4_ = (uint)bVar13 * auVar250._52_4_ | (uint)!bVar13 * auVar180._52_4_;
            bVar13 = (bool)((byte)(uVar88 >> 0xe) & 1);
            auVar181._56_4_ = (uint)bVar13 * auVar250._56_4_ | (uint)!bVar13 * auVar180._56_4_;
            bVar13 = SUB81(uVar88 >> 0xf,0);
            auVar181._60_4_ = (uint)bVar13 * auVar250._60_4_ | (uint)!bVar13 * auVar180._60_4_;
            auVar250 = vmulps_avx512f(auVar181,auVar181);
            auVar180 = vfmadd132ps_avx512f(auVar181,(undefined1  [64])_ps512_cephes_log_p1,
                                           (undefined1  [64])_ps512_cephes_log_p0);
            auVar180 = vfmadd213ps_avx512f(auVar180,auVar181,(undefined1  [64])_ps512_cephes_log_p2)
            ;
            auVar180 = vfmadd213ps_avx512f(auVar180,auVar181,(undefined1  [64])_ps512_cephes_log_p3)
            ;
            auVar180 = vfmadd213ps_avx512f(auVar180,auVar181,(undefined1  [64])_ps512_cephes_log_p4)
            ;
            auVar180 = vfmadd213ps_avx512f(auVar180,auVar181,(undefined1  [64])_ps512_cephes_log_p5)
            ;
            auVar180 = vfmadd213ps_avx512f(auVar180,auVar181,(undefined1  [64])_ps512_cephes_log_p6)
            ;
            auVar180 = vfmadd213ps_avx512f(auVar180,auVar181,(undefined1  [64])_ps512_cephes_log_p7)
            ;
            in_ZMM21 = vfmadd213ps_avx512f(auVar180,auVar181,(undefined1  [64])_ps512_cephes_log_p8)
            ;
            auVar180 = vmulps_avx512f(auVar250,auVar181);
            auVar180 = vfmadd213ps_avx512f(auVar180,in_ZMM21,auVar181);
            uVar15 = vcmpps_avx512f(auVar249,auVar251,2);
            auVar249 = vpsubd_avx512f(auVar179,auVar175);
            auVar249 = vcvtdq2ps_avx512f(auVar249);
            auVar179 = vaddps_avx512f(auVar249,(undefined1  [64])afVar71);
            bVar13 = (bool)((byte)uVar88 & 1);
            auVar182._0_4_ = (uint)bVar13 * auVar249._0_4_ | (uint)!bVar13 * auVar179._0_4_;
            bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
            auVar182._4_4_ = (uint)bVar13 * auVar249._4_4_ | (uint)!bVar13 * auVar179._4_4_;
            bVar13 = (bool)((byte)(uVar88 >> 2) & 1);
            auVar182._8_4_ = (uint)bVar13 * auVar249._8_4_ | (uint)!bVar13 * auVar179._8_4_;
            bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar182._12_4_ = (uint)bVar13 * auVar249._12_4_ | (uint)!bVar13 * auVar179._12_4_;
            bVar13 = (bool)((byte)(uVar88 >> 4) & 1);
            auVar182._16_4_ = (uint)bVar13 * auVar249._16_4_ | (uint)!bVar13 * auVar179._16_4_;
            bVar13 = (bool)((byte)(uVar88 >> 5) & 1);
            auVar182._20_4_ = (uint)bVar13 * auVar249._20_4_ | (uint)!bVar13 * auVar179._20_4_;
            bVar13 = (bool)((byte)(uVar88 >> 6) & 1);
            auVar182._24_4_ = (uint)bVar13 * auVar249._24_4_ | (uint)!bVar13 * auVar179._24_4_;
            bVar13 = (bool)((byte)(uVar88 >> 7) & 1);
            auVar182._28_4_ = (uint)bVar13 * auVar249._28_4_ | (uint)!bVar13 * auVar179._28_4_;
            bVar13 = (bool)(bVar14 & 1);
            auVar182._32_4_ = (uint)bVar13 * auVar249._32_4_ | (uint)!bVar13 * auVar179._32_4_;
            bVar13 = (bool)((byte)(uVar88 >> 9) & 1);
            auVar182._36_4_ = (uint)bVar13 * auVar249._36_4_ | (uint)!bVar13 * auVar179._36_4_;
            bVar13 = (bool)((byte)(uVar88 >> 10) & 1);
            auVar182._40_4_ = (uint)bVar13 * auVar249._40_4_ | (uint)!bVar13 * auVar179._40_4_;
            bVar13 = (bool)((byte)(uVar88 >> 0xb) & 1);
            auVar182._44_4_ = (uint)bVar13 * auVar249._44_4_ | (uint)!bVar13 * auVar179._44_4_;
            bVar13 = (bool)((byte)(uVar88 >> 0xc) & 1);
            auVar182._48_4_ = (uint)bVar13 * auVar249._48_4_ | (uint)!bVar13 * auVar179._48_4_;
            bVar13 = (bool)((byte)(uVar88 >> 0xd) & 1);
            auVar182._52_4_ = (uint)bVar13 * auVar249._52_4_ | (uint)!bVar13 * auVar179._52_4_;
            bVar13 = (bool)((byte)(uVar88 >> 0xe) & 1);
            auVar182._56_4_ = (uint)bVar13 * auVar249._56_4_ | (uint)!bVar13 * auVar179._56_4_;
            bVar13 = SUB81(uVar88 >> 0xf,0);
            auVar182._60_4_ = (uint)bVar13 * auVar249._60_4_ | (uint)!bVar13 * auVar179._60_4_;
            auVar249 = vfmadd231ps_avx512f(auVar180,auVar182,(undefined1  [64])afVar81);
            auVar249 = vfmadd231ps_avx512f(auVar249,auVar176,auVar250);
            in_ZMM22 = vfmadd231ps_avx512f(auVar249,(undefined1  [64])afVar82,auVar182);
            auVar249 = vmulps_avx512f(in_ZMM22,auVar178);
            auVar179 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
            bVar13 = (bool)((byte)uVar15 & 1);
            auVar250._0_4_ = (uint)bVar13 * auVar179._0_4_ | (uint)!bVar13 * auVar249._0_4_;
            bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
            auVar250._4_4_ = (uint)bVar13 * auVar179._4_4_ | (uint)!bVar13 * auVar249._4_4_;
            bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
            auVar250._8_4_ = (uint)bVar13 * auVar179._8_4_ | (uint)!bVar13 * auVar249._8_4_;
            bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
            auVar250._12_4_ = (uint)bVar13 * auVar179._12_4_ | (uint)!bVar13 * auVar249._12_4_;
            bVar13 = (bool)((byte)(uVar15 >> 4) & 1);
            auVar250._16_4_ = (uint)bVar13 * auVar179._16_4_ | (uint)!bVar13 * auVar249._16_4_;
            bVar13 = (bool)((byte)(uVar15 >> 5) & 1);
            auVar250._20_4_ = (uint)bVar13 * auVar179._20_4_ | (uint)!bVar13 * auVar249._20_4_;
            bVar13 = (bool)((byte)(uVar15 >> 6) & 1);
            auVar250._24_4_ = (uint)bVar13 * auVar179._24_4_ | (uint)!bVar13 * auVar249._24_4_;
            bVar13 = (bool)((byte)(uVar15 >> 7) & 1);
            auVar250._28_4_ = (uint)bVar13 * auVar179._28_4_ | (uint)!bVar13 * auVar249._28_4_;
            bVar13 = (bool)((byte)(uVar15 >> 8) & 1);
            auVar250._32_4_ = (uint)bVar13 * auVar179._32_4_ | (uint)!bVar13 * auVar249._32_4_;
            bVar13 = (bool)((byte)(uVar15 >> 9) & 1);
            auVar250._36_4_ = (uint)bVar13 * auVar179._36_4_ | (uint)!bVar13 * auVar249._36_4_;
            bVar13 = (bool)((byte)(uVar15 >> 10) & 1);
            auVar250._40_4_ = (uint)bVar13 * auVar179._40_4_ | (uint)!bVar13 * auVar249._40_4_;
            bVar13 = (bool)((byte)(uVar15 >> 0xb) & 1);
            auVar250._44_4_ = (uint)bVar13 * auVar179._44_4_ | (uint)!bVar13 * auVar249._44_4_;
            bVar13 = (bool)((byte)(uVar15 >> 0xc) & 1);
            auVar250._48_4_ = (uint)bVar13 * auVar179._48_4_ | (uint)!bVar13 * auVar249._48_4_;
            bVar13 = (bool)((byte)(uVar15 >> 0xd) & 1);
            auVar250._52_4_ = (uint)bVar13 * auVar179._52_4_ | (uint)!bVar13 * auVar249._52_4_;
            bVar13 = (bool)((byte)(uVar15 >> 0xe) & 1);
            auVar250._56_4_ = (uint)bVar13 * auVar179._56_4_ | (uint)!bVar13 * auVar249._56_4_;
            bVar13 = SUB81(uVar15 >> 0xf,0);
            auVar250._60_4_ = (uint)bVar13 * auVar179._60_4_ | (uint)!bVar13 * auVar249._60_4_;
            auVar249 = vminps_avx512f(auVar250,(undefined1  [64])afVar72);
            auVar249 = vmaxps_avx512f(auVar249,(undefined1  [64])afVar73);
            auVar250 = vfmadd213ps_avx512f((undefined1  [64])afVar74,auVar249,
                                           (undefined1  [64])afVar80);
            auVar179 = vrndscaleps_avx512f(auVar250,1);
            uVar88 = vcmpps_avx512f(auVar250,auVar179,1);
            auVar250 = vsubps_avx512f(auVar179,(undefined1  [64])afVar71);
            bVar13 = (bool)((byte)uVar88 & 1);
            in_ZMM19._0_4_ = (uint)bVar13 * auVar250._0_4_ | (uint)!bVar13 * auVar179._0_4_;
            bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
            in_ZMM19._4_4_ = (uint)bVar13 * auVar250._4_4_ | (uint)!bVar13 * auVar179._4_4_;
            bVar13 = (bool)((byte)(uVar88 >> 2) & 1);
            in_ZMM19._8_4_ = (uint)bVar13 * auVar250._8_4_ | (uint)!bVar13 * auVar179._8_4_;
            bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
            in_ZMM19._12_4_ = (uint)bVar13 * auVar250._12_4_ | (uint)!bVar13 * auVar179._12_4_;
            bVar13 = (bool)((byte)(uVar88 >> 4) & 1);
            in_ZMM19._16_4_ = (uint)bVar13 * auVar250._16_4_ | (uint)!bVar13 * auVar179._16_4_;
            bVar13 = (bool)((byte)(uVar88 >> 5) & 1);
            in_ZMM19._20_4_ = (uint)bVar13 * auVar250._20_4_ | (uint)!bVar13 * auVar179._20_4_;
            bVar13 = (bool)((byte)(uVar88 >> 6) & 1);
            in_ZMM19._24_4_ = (uint)bVar13 * auVar250._24_4_ | (uint)!bVar13 * auVar179._24_4_;
            bVar13 = (bool)((byte)(uVar88 >> 7) & 1);
            in_ZMM19._28_4_ = (uint)bVar13 * auVar250._28_4_ | (uint)!bVar13 * auVar179._28_4_;
            bVar13 = (bool)((byte)(uVar88 >> 8) & 1);
            in_ZMM19._32_4_ = (uint)bVar13 * auVar250._32_4_ | (uint)!bVar13 * auVar179._32_4_;
            bVar13 = (bool)((byte)(uVar88 >> 9) & 1);
            in_ZMM19._36_4_ = (uint)bVar13 * auVar250._36_4_ | (uint)!bVar13 * auVar179._36_4_;
            bVar13 = (bool)((byte)(uVar88 >> 10) & 1);
            in_ZMM19._40_4_ = (uint)bVar13 * auVar250._40_4_ | (uint)!bVar13 * auVar179._40_4_;
            bVar13 = (bool)((byte)(uVar88 >> 0xb) & 1);
            in_ZMM19._44_4_ = (uint)bVar13 * auVar250._44_4_ | (uint)!bVar13 * auVar179._44_4_;
            bVar13 = (bool)((byte)(uVar88 >> 0xc) & 1);
            in_ZMM19._48_4_ = (uint)bVar13 * auVar250._48_4_ | (uint)!bVar13 * auVar179._48_4_;
            bVar13 = (bool)((byte)(uVar88 >> 0xd) & 1);
            in_ZMM19._52_4_ = (uint)bVar13 * auVar250._52_4_ | (uint)!bVar13 * auVar179._52_4_;
            bVar13 = (bool)((byte)(uVar88 >> 0xe) & 1);
            in_ZMM19._56_4_ = (uint)bVar13 * auVar250._56_4_ | (uint)!bVar13 * auVar179._56_4_;
            bVar13 = SUB81(uVar88 >> 0xf,0);
            in_ZMM19._60_4_ = (uint)bVar13 * auVar250._60_4_ | (uint)!bVar13 * auVar179._60_4_;
            auVar249 = vfmadd231ps_avx512f(auVar249,in_ZMM19,auVar173);
            auVar249 = vfmadd231ps_avx512f(auVar249,in_ZMM19,auVar174);
            auVar250 = vmulps_avx512f(auVar249,auVar249);
            auVar179 = vfmadd213ps_avx512f(auVar249,(undefined1  [64])afVar75,
                                           (undefined1  [64])afVar76);
            auVar179 = vfmadd213ps_avx512f(auVar179,auVar249,(undefined1  [64])afVar77);
            auVar179 = vfmadd213ps_avx512f(auVar179,auVar249,(undefined1  [64])afVar78);
            auVar179 = vfmadd213ps_avx512f(auVar179,auVar249,(undefined1  [64])afVar79);
            auVar179 = vfmadd213ps_avx512f(auVar179,auVar249,(undefined1  [64])afVar80);
            in_ZMM20 = vfmadd213ps_avx512f(auVar179,auVar250,auVar249);
            auVar249 = vaddps_avx512f(in_ZMM20,(undefined1  [64])afVar71);
            auVar250 = vcvttps2dq_avx512f(in_ZMM19);
            auVar250 = vpaddd_avx512f(auVar250,auVar175);
            auVar250 = vpslld_avx512f(auVar250,0x17);
            in_ZMM18 = vfmadd213ps_avx512f(auVar250,auVar249,auVar177);
            auVar249 = vdivps_avx512f(auVar177,in_ZMM18);
            in_ZMM17 = vfnmsub213ps_avx512f(auVar249,auVar178,auVar177);
            goto LAB_00292d54;
          case 6:
            puVar8 = (uint *)(this->super_InnerProduct).activation_params.data;
            auVar250 = vbroadcastss_avx512f(ZEXT416(*puVar8));
            uVar4 = puVar8[1];
            auVar249._4_4_ = uVar4;
            auVar249._0_4_ = uVar4;
            auVar249._8_4_ = uVar4;
            auVar249._12_4_ = uVar4;
            auVar249._16_4_ = uVar4;
            auVar249._20_4_ = uVar4;
            auVar249._24_4_ = uVar4;
            auVar249._28_4_ = uVar4;
            auVar249._32_4_ = uVar4;
            auVar249._36_4_ = uVar4;
            auVar249._40_4_ = uVar4;
            auVar249._44_4_ = uVar4;
            auVar249._48_4_ = uVar4;
            auVar249._52_4_ = uVar4;
            auVar249._56_4_ = uVar4;
            auVar249._60_4_ = uVar4;
            auVar249 = vfmadd213ps_avx512f(auVar250,auVar248,auVar249);
            auVar249 = vmaxps_avx512f(auVar249,auVar251);
            in_ZMM17 = vminps_avx512f(auVar249,auVar177);
LAB_00292d54:
            in_ZMM16 = vmulps_avx512f(in_ZMM17,auVar248);
          }
          *(undefined1 (*) [64])((long)top_blob->data + uVar85 * 0x40) = in_ZMM16;
        }
      }
    }
  }
LAB_002946c1:
  if (piStack_100 != (int *)0x0) {
    LOCK();
    *piStack_100 = *piStack_100 + -1;
    UNLOCK();
    if (*piStack_100 == 0) {
      if (local_e8 == (Allocator *)0x0) {
        free(local_108);
      }
      else {
        (*local_e8->_vptr_Allocator[3])();
      }
    }
  }
  return local_148;
}

Assistant:

int InnerProduct_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

#if NCNN_F16C && __AVX__
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return forward_fp16s(bottom_blob, top_blob, opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
        if (bottom_blob_flattened.empty())
            return -100;
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    innerproduct_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

    return 0;
}